

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O0

void ihevc_inter_pred_luma_vert_w16out_ssse3
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined8 *puVar75;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  ulong *in_R8;
  int in_R9D;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  __m128i s32_8x16b;
  __m128i s31_8x16b;
  __m128i s30_8x16b;
  __m128i s26_8x16b;
  __m128i s25_8x16b;
  __m128i s24_8x16b;
  __m128i s23_8x16b;
  __m128i s22_8x16b;
  __m128i s21_8x16b;
  __m128i s20_8x16b;
  __m128i s16_8x16b;
  __m128i s15_8x16b;
  __m128i s14_8x16b;
  __m128i s13_8x16b;
  __m128i s12_8x16b;
  __m128i s11_8x16b;
  __m128i s10_8x16b;
  __m128i s4_4_16x8b;
  __m128i s4_3_16x8b;
  __m128i s4_2_16x8b;
  __m128i s4_1_16x8b;
  __m128i s4_0_16x8b;
  __m128i s3_4_16x8b;
  __m128i s3_3_16x8b;
  __m128i s3_2_16x8b;
  __m128i s3_1_16x8b;
  __m128i s3_0_16x8b;
  __m128i s2_10_16x8b;
  __m128i s2_9_16x8b;
  __m128i s2_8_16x8b;
  __m128i s2_7_16x8b;
  __m128i s2_6_16x8b;
  __m128i s2_5_16x8b;
  __m128i s2_4_16x8b;
  __m128i s2_3_16x8b;
  __m128i s2_2_16x8b;
  __m128i s2_1_16x8b;
  __m128i s2_0_16x8b;
  __m128i s6_8x16b;
  __m128i s5_8x16b;
  __m128i s4_8x16b;
  __m128i s3_8x16b;
  __m128i s2_8x16b;
  __m128i s1_8x16b;
  __m128i s0_8x16b;
  __m128i coeff6_7_8x16b;
  __m128i coeff4_5_8x16b;
  __m128i coeff2_3_8x16b;
  __m128i coeff0_1_8x16b;
  WORD16 *pi2_dst_copy;
  UWORD8 *pu1_src_copy;
  WORD32 col;
  WORD32 row;
  undefined1 uStack_1aa7;
  undefined1 uStack_1aa5;
  undefined1 uStack_1aa3;
  undefined1 uStack_1aa1;
  undefined1 uStack_1a9f;
  undefined1 uStack_1a9d;
  undefined1 uStack_1a9b;
  undefined1 uStack_1a99;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 uStack_1a70;
  undefined8 uStack_1a60;
  undefined1 local_1a58;
  undefined1 uStack_1a57;
  undefined1 uStack_1a56;
  undefined1 uStack_1a55;
  undefined1 uStack_1a54;
  undefined1 uStack_1a53;
  undefined1 uStack_1a52;
  undefined1 uStack_1a51;
  undefined1 uStack_1a50;
  undefined1 uStack_1a4f;
  undefined1 uStack_1a4e;
  undefined1 uStack_1a4d;
  undefined1 uStack_1a4c;
  undefined1 uStack_1a4b;
  undefined1 uStack_1a4a;
  undefined1 uStack_1a49;
  undefined1 local_1a48;
  undefined1 uStack_1a47;
  undefined1 uStack_1a46;
  undefined1 uStack_1a45;
  undefined1 uStack_1a44;
  undefined1 uStack_1a43;
  undefined1 uStack_1a42;
  undefined1 uStack_1a41;
  undefined1 uStack_1a40;
  undefined1 uStack_1a3f;
  undefined1 uStack_1a3e;
  undefined1 uStack_1a3d;
  undefined1 uStack_1a3c;
  undefined1 uStack_1a3b;
  undefined1 uStack_1a3a;
  undefined1 uStack_1a39;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a20;
  undefined8 uStack_1a10;
  undefined8 local_1a08;
  int local_1894;
  int local_1890;
  undefined8 *local_1878;
  undefined8 *local_1870;
  undefined1 local_12f8;
  undefined1 uStack_12f7;
  undefined1 uStack_12f6;
  undefined1 uStack_12f5;
  undefined1 uStack_12f4;
  undefined1 uStack_12f3;
  undefined1 uStack_12f2;
  undefined1 uStack_12f1;
  undefined1 local_12b8;
  undefined1 uStack_12b7;
  undefined1 uStack_12b6;
  undefined1 uStack_12b5;
  undefined1 uStack_12b4;
  undefined1 uStack_12b3;
  undefined1 uStack_12b2;
  undefined1 uStack_12b1;
  undefined1 local_12a8;
  undefined1 uStack_12a7;
  undefined1 uStack_12a6;
  undefined1 uStack_12a5;
  undefined1 uStack_12a4;
  undefined1 uStack_12a3;
  undefined1 uStack_12a2;
  undefined1 uStack_12a1;
  undefined1 local_1298;
  undefined1 uStack_1297;
  undefined1 uStack_1296;
  undefined1 uStack_1295;
  undefined1 uStack_1294;
  undefined1 uStack_1293;
  undefined1 uStack_1292;
  undefined1 uStack_1291;
  undefined1 local_1288;
  undefined1 uStack_1287;
  undefined1 uStack_1286;
  undefined1 uStack_1285;
  undefined1 uStack_1284;
  undefined1 uStack_1283;
  undefined1 uStack_1282;
  undefined1 uStack_1281;
  undefined1 local_1278;
  undefined1 uStack_1277;
  undefined1 uStack_1276;
  undefined1 uStack_1275;
  undefined1 uStack_1274;
  undefined1 uStack_1273;
  undefined1 uStack_1272;
  undefined1 uStack_1271;
  undefined1 local_11d8;
  undefined1 uStack_11d7;
  undefined1 uStack_11d6;
  undefined1 uStack_11d5;
  undefined1 uStack_11d4;
  undefined1 uStack_11d3;
  undefined1 uStack_11d2;
  undefined1 uStack_11d1;
  undefined1 local_11c8;
  undefined1 uStack_11c7;
  undefined1 uStack_11c6;
  undefined1 uStack_11c5;
  undefined1 uStack_11c4;
  undefined1 uStack_11c3;
  undefined1 uStack_11c2;
  undefined1 uStack_11c1;
  undefined1 local_11b8;
  undefined1 uStack_11b7;
  undefined1 uStack_11b6;
  undefined1 uStack_11b5;
  undefined1 uStack_11b4;
  undefined1 uStack_11b3;
  undefined1 uStack_11b2;
  undefined1 uStack_11b1;
  undefined1 local_11a8;
  undefined1 uStack_11a7;
  undefined1 uStack_11a6;
  undefined1 uStack_11a5;
  undefined1 uStack_11a4;
  undefined1 uStack_11a3;
  undefined1 uStack_11a2;
  undefined1 uStack_11a1;
  undefined1 local_1198;
  undefined1 uStack_1197;
  undefined1 uStack_1196;
  undefined1 uStack_1195;
  undefined1 uStack_1194;
  undefined1 uStack_1193;
  undefined1 uStack_1192;
  undefined1 uStack_1191;
  undefined1 uStack_1187;
  undefined1 uStack_1186;
  undefined1 uStack_1185;
  undefined1 uStack_1184;
  undefined1 uStack_1183;
  undefined1 uStack_1182;
  undefined1 uStack_1181;
  undefined1 local_1178;
  undefined1 uStack_1177;
  undefined1 uStack_1176;
  undefined1 uStack_1175;
  undefined1 uStack_1174;
  undefined1 uStack_1173;
  undefined1 uStack_1172;
  undefined1 uStack_1171;
  undefined1 uStack_1167;
  undefined1 uStack_1166;
  undefined1 uStack_1165;
  undefined1 uStack_1164;
  undefined1 uStack_1163;
  undefined1 uStack_1162;
  undefined1 uStack_1161;
  undefined1 local_1158;
  undefined1 uStack_1157;
  undefined1 uStack_1156;
  undefined1 uStack_1155;
  undefined1 uStack_1154;
  undefined1 uStack_1153;
  undefined1 uStack_1152;
  undefined1 uStack_1151;
  undefined1 uStack_1147;
  undefined1 uStack_1146;
  undefined1 uStack_1145;
  undefined1 uStack_1144;
  undefined1 uStack_1143;
  undefined1 uStack_1142;
  undefined1 uStack_1141;
  undefined1 local_1138;
  undefined1 uStack_1137;
  undefined1 uStack_1136;
  undefined1 uStack_1135;
  undefined1 uStack_1134;
  undefined1 uStack_1133;
  undefined1 uStack_1132;
  undefined1 uStack_1131;
  undefined1 local_10f8;
  undefined1 uStack_10f7;
  undefined1 uStack_10f6;
  undefined1 uStack_10f5;
  undefined1 uStack_10f4;
  undefined1 uStack_10f3;
  undefined1 uStack_10f2;
  undefined1 uStack_10f1;
  undefined1 local_10e8;
  undefined1 uStack_10e7;
  undefined1 uStack_10e6;
  undefined1 uStack_10e5;
  undefined1 uStack_10e4;
  undefined1 uStack_10e3;
  undefined1 uStack_10e2;
  undefined1 uStack_10e1;
  undefined1 local_10d8;
  undefined1 uStack_10d7;
  undefined1 uStack_10d6;
  undefined1 uStack_10d5;
  undefined1 uStack_10d4;
  undefined1 uStack_10d3;
  undefined1 uStack_10d2;
  undefined1 uStack_10d1;
  undefined1 local_10c8;
  undefined1 uStack_10c7;
  undefined1 uStack_10c6;
  undefined1 uStack_10c5;
  undefined1 uStack_10c4;
  undefined1 uStack_10c3;
  undefined1 uStack_10c2;
  undefined1 uStack_10c1;
  undefined1 local_10b8;
  undefined1 uStack_10b7;
  undefined1 uStack_10b6;
  undefined1 uStack_10b5;
  undefined1 uStack_10b4;
  undefined1 uStack_10b3;
  undefined1 uStack_10b2;
  undefined1 uStack_10b1;
  undefined1 local_1018;
  undefined1 uStack_1017;
  undefined1 uStack_1016;
  undefined1 uStack_1015;
  undefined1 uStack_1014;
  undefined1 uStack_1013;
  undefined1 uStack_1012;
  undefined1 uStack_1011;
  undefined1 local_1008;
  undefined1 uStack_1007;
  undefined1 uStack_1006;
  undefined1 uStack_1005;
  undefined1 uStack_1004;
  undefined1 uStack_1003;
  undefined1 uStack_1002;
  undefined1 uStack_1001;
  undefined1 local_ff8;
  undefined1 uStack_ff7;
  undefined1 uStack_ff6;
  undefined1 uStack_ff5;
  undefined1 uStack_ff4;
  undefined1 uStack_ff3;
  undefined1 uStack_ff2;
  undefined1 uStack_ff1;
  undefined1 local_fe8;
  undefined1 uStack_fe7;
  undefined1 uStack_fe6;
  undefined1 uStack_fe5;
  undefined1 uStack_fe4;
  undefined1 uStack_fe3;
  undefined1 uStack_fe2;
  undefined1 uStack_fe1;
  undefined1 local_fd8;
  undefined1 uStack_fd7;
  undefined1 uStack_fd6;
  undefined1 uStack_fd5;
  undefined1 uStack_fd4;
  undefined1 uStack_fd3;
  undefined1 uStack_fd2;
  undefined1 uStack_fd1;
  undefined1 uStack_fc7;
  undefined1 uStack_fc6;
  undefined1 uStack_fc5;
  undefined1 uStack_fc4;
  undefined1 uStack_fc3;
  undefined1 uStack_fc2;
  undefined1 uStack_fc1;
  undefined1 local_fb8;
  undefined1 uStack_fb7;
  undefined1 uStack_fb6;
  undefined1 uStack_fb5;
  undefined1 uStack_fb4;
  undefined1 uStack_fb3;
  undefined1 uStack_fb2;
  undefined1 uStack_fb1;
  undefined1 uStack_fa7;
  undefined1 uStack_fa6;
  undefined1 uStack_fa5;
  undefined1 uStack_fa4;
  undefined1 uStack_fa3;
  undefined1 uStack_fa2;
  undefined1 uStack_fa1;
  undefined1 local_f98;
  undefined1 uStack_f97;
  undefined1 uStack_f96;
  undefined1 uStack_f95;
  undefined1 uStack_f94;
  undefined1 uStack_f93;
  undefined1 uStack_f92;
  undefined1 uStack_f91;
  undefined1 uStack_f87;
  undefined1 uStack_f86;
  undefined1 uStack_f85;
  undefined1 uStack_f84;
  undefined1 uStack_f83;
  undefined1 uStack_f82;
  undefined1 uStack_f81;
  short local_758;
  short sStack_756;
  short sStack_754;
  short sStack_752;
  short local_748;
  short sStack_746;
  short sStack_744;
  short sStack_742;
  short local_738;
  short sStack_736;
  short sStack_734;
  short sStack_732;
  short local_728;
  short sStack_726;
  short sStack_724;
  short sStack_722;
  short local_6f8;
  short sStack_6f6;
  short sStack_6f4;
  short sStack_6f2;
  short local_6e8;
  short sStack_6e6;
  short sStack_6e4;
  short sStack_6e2;
  short local_6d8;
  short sStack_6d6;
  short sStack_6d4;
  short sStack_6d2;
  short local_6c8;
  short sStack_6c6;
  short sStack_6c4;
  short sStack_6c2;
  short local_698;
  short sStack_696;
  short sStack_694;
  short sStack_692;
  short local_688;
  short sStack_686;
  short sStack_684;
  short sStack_682;
  short local_678;
  short sStack_676;
  short sStack_674;
  short sStack_672;
  short local_668;
  short sStack_666;
  short sStack_664;
  short sStack_662;
  short local_638;
  short sStack_636;
  short sStack_634;
  short sStack_632;
  short local_628;
  short sStack_626;
  short sStack_624;
  short sStack_622;
  short local_618;
  short sStack_616;
  short sStack_614;
  short sStack_612;
  short local_608;
  short sStack_606;
  short sStack_604;
  short sStack_602;
  short local_5d8;
  short sStack_5d6;
  short sStack_5d4;
  short sStack_5d2;
  short local_5c8;
  short sStack_5c6;
  short sStack_5c4;
  short sStack_5c2;
  short local_5b8;
  short sStack_5b6;
  short sStack_5b4;
  short sStack_5b2;
  short local_5a8;
  short sStack_5a6;
  short sStack_5a4;
  short sStack_5a2;
  short local_578;
  short sStack_576;
  short sStack_574;
  short sStack_572;
  short local_568;
  short sStack_566;
  short sStack_564;
  short sStack_562;
  short local_558;
  short sStack_556;
  short sStack_554;
  short sStack_552;
  short local_548;
  short sStack_546;
  short sStack_544;
  short sStack_542;
  short local_518;
  short sStack_516;
  short sStack_514;
  short sStack_512;
  short local_508;
  short sStack_506;
  short sStack_504;
  short sStack_502;
  short local_4f8;
  short sStack_4f6;
  short sStack_4f4;
  short sStack_4f2;
  short local_4e8;
  short sStack_4e6;
  short sStack_4e4;
  short sStack_4e2;
  short local_4b8;
  short sStack_4b6;
  short sStack_4b4;
  short sStack_4b2;
  short local_4a8;
  short sStack_4a6;
  short sStack_4a4;
  short sStack_4a2;
  short local_498;
  short sStack_496;
  short sStack_494;
  short sStack_492;
  short local_488;
  short sStack_486;
  short sStack_484;
  short sStack_482;
  short local_458;
  short sStack_456;
  short sStack_454;
  short sStack_452;
  short sStack_450;
  short sStack_44e;
  short sStack_44c;
  short sStack_44a;
  short local_448;
  short sStack_446;
  short sStack_444;
  short sStack_442;
  short sStack_440;
  short sStack_43e;
  short sStack_43c;
  short sStack_43a;
  short local_438;
  short sStack_436;
  short sStack_434;
  short sStack_432;
  short sStack_430;
  short sStack_42e;
  short sStack_42c;
  short sStack_42a;
  short local_428;
  short sStack_426;
  short sStack_424;
  short sStack_422;
  short sStack_420;
  short sStack_41e;
  short sStack_41c;
  short sStack_41a;
  short local_3f8;
  short sStack_3f6;
  short sStack_3f4;
  short sStack_3f2;
  short sStack_3f0;
  short sStack_3ee;
  short sStack_3ec;
  short sStack_3ea;
  short local_3e8;
  short sStack_3e6;
  short sStack_3e4;
  short sStack_3e2;
  short sStack_3e0;
  short sStack_3de;
  short sStack_3dc;
  short sStack_3da;
  short local_3d8;
  short sStack_3d6;
  short sStack_3d4;
  short sStack_3d2;
  short sStack_3d0;
  short sStack_3ce;
  short sStack_3cc;
  short sStack_3ca;
  short local_3c8;
  short sStack_3c6;
  short sStack_3c4;
  short sStack_3c2;
  short sStack_3c0;
  short sStack_3be;
  short sStack_3bc;
  short sStack_3ba;
  short local_398;
  short sStack_396;
  short sStack_394;
  short sStack_392;
  short sStack_390;
  short sStack_38e;
  short sStack_38c;
  short sStack_38a;
  short local_388;
  short sStack_386;
  short sStack_384;
  short sStack_382;
  short sStack_380;
  short sStack_37e;
  short sStack_37c;
  short sStack_37a;
  short local_378;
  short sStack_376;
  short sStack_374;
  short sStack_372;
  short sStack_370;
  short sStack_36e;
  short sStack_36c;
  short sStack_36a;
  short local_368;
  short sStack_366;
  short sStack_364;
  short sStack_362;
  short sStack_360;
  short sStack_35e;
  short sStack_35c;
  short sStack_35a;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  short local_328;
  short sStack_326;
  short sStack_324;
  short sStack_322;
  short sStack_320;
  short sStack_31e;
  short sStack_31c;
  short sStack_31a;
  short local_318;
  short sStack_316;
  short sStack_314;
  short sStack_312;
  short sStack_310;
  short sStack_30e;
  short sStack_30c;
  short sStack_30a;
  short local_308;
  short sStack_306;
  short sStack_304;
  short sStack_302;
  short sStack_300;
  short sStack_2fe;
  short sStack_2fc;
  short sStack_2fa;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  short local_2c8;
  short sStack_2c6;
  short sStack_2c4;
  short sStack_2c2;
  short sStack_2c0;
  short sStack_2be;
  short sStack_2bc;
  short sStack_2ba;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short local_2a8;
  short sStack_2a6;
  short sStack_2a4;
  short sStack_2a2;
  short sStack_2a0;
  short sStack_29e;
  short sStack_29c;
  short sStack_29a;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  short sStack_26a;
  short local_268;
  short sStack_266;
  short sStack_264;
  short sStack_262;
  short sStack_260;
  short sStack_25e;
  short sStack_25c;
  short sStack_25a;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  __m128i control_mask_4_8x16b;
  __m128i control_mask_3_8x16b;
  __m128i control_mask_2_8x16b;
  __m128i control_mask_1_8x16b;
  __m128i s36_8x16b;
  __m128i s35_8x16b;
  __m128i s34_8x16b;
  __m128i s33_8x16b;
  
  uVar1 = *in_R8;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar1;
  auVar76._8_8_ = 0x100010001000100;
  auVar76._0_8_ = 0x100010001000100;
  auVar76 = pshufb(auVar83,auVar76);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar1;
  auVar77._8_8_ = 0x302030203020302;
  auVar77._0_8_ = 0x302030203020302;
  auVar77 = pshufb(auVar82,auVar77);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar1;
  auVar78._8_8_ = 0x504050405040504;
  auVar78._0_8_ = 0x504050405040504;
  auVar78 = pshufb(auVar81,auVar78);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar1;
  auVar79._8_8_ = 0x706070607060706;
  auVar79._0_8_ = 0x706070607060706;
  auVar79 = pshufb(auVar80,auVar79);
  if ((int)s32_8x16b[1] % 8 == 0) {
    for (local_1894 = 0; local_1894 < (int)s32_8x16b[1]; local_1894 = local_1894 + 8) {
      local_1870 = (undefined8 *)(in_RDI + local_1894);
      local_1878 = (undefined8 *)(in_RSI + (long)local_1894 * 2);
      uVar2 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * -3));
      uVar3 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * -2));
      uStack_f87 = (undefined1)((ulong)uVar2 >> 8);
      uStack_f86 = (undefined1)((ulong)uVar2 >> 0x10);
      uStack_f85 = (undefined1)((ulong)uVar2 >> 0x18);
      uStack_f84 = (undefined1)((ulong)uVar2 >> 0x20);
      uStack_f83 = (undefined1)((ulong)uVar2 >> 0x28);
      uStack_f82 = (undefined1)((ulong)uVar2 >> 0x30);
      uStack_f81 = (undefined1)((ulong)uVar2 >> 0x38);
      local_f98 = (undefined1)uVar3;
      uStack_f97 = (undefined1)((ulong)uVar3 >> 8);
      uStack_f96 = (undefined1)((ulong)uVar3 >> 0x10);
      uStack_f95 = (undefined1)((ulong)uVar3 >> 0x18);
      uStack_f94 = (undefined1)((ulong)uVar3 >> 0x20);
      uStack_f93 = (undefined1)((ulong)uVar3 >> 0x28);
      uStack_f92 = (undefined1)((ulong)uVar3 >> 0x30);
      uStack_f91 = (undefined1)((ulong)uVar3 >> 0x38);
      auVar74[1] = local_f98;
      auVar74[0] = (char)uVar2;
      auVar74[2] = uStack_f87;
      auVar74[3] = uStack_f97;
      auVar74[4] = uStack_f86;
      auVar74[5] = uStack_f96;
      auVar74[6] = uStack_f85;
      auVar74[7] = uStack_f95;
      uStack_1a10._0_2_ = CONCAT11(uStack_f94,uStack_f84);
      uStack_1a10._0_3_ = CONCAT12(uStack_f83,(undefined2)uStack_1a10);
      uStack_1a10._0_4_ = CONCAT13(uStack_f93,(undefined3)uStack_1a10);
      uStack_1a10._0_5_ = CONCAT14(uStack_f82,(undefined4)uStack_1a10);
      uStack_1a10._0_6_ = CONCAT15(uStack_f92,(undefined5)uStack_1a10);
      uStack_1a10._0_7_ = CONCAT16(uStack_f81,(undefined6)uStack_1a10);
      uStack_1a10 = CONCAT17(uStack_f91,(undefined7)uStack_1a10);
      auVar74._8_8_ = uStack_1a10;
      auVar80 = pmaddubsw(auVar74,auVar76);
      uVar2 = *(undefined8 *)((long)local_1870 + (long)-in_EDX);
      uVar3 = *local_1870;
      uStack_fa7 = (undefined1)((ulong)uVar2 >> 8);
      uStack_fa6 = (undefined1)((ulong)uVar2 >> 0x10);
      uStack_fa5 = (undefined1)((ulong)uVar2 >> 0x18);
      uStack_fa4 = (undefined1)((ulong)uVar2 >> 0x20);
      uStack_fa3 = (undefined1)((ulong)uVar2 >> 0x28);
      uStack_fa2 = (undefined1)((ulong)uVar2 >> 0x30);
      uStack_fa1 = (undefined1)((ulong)uVar2 >> 0x38);
      local_fb8 = (undefined1)uVar3;
      uStack_fb7 = (undefined1)((ulong)uVar3 >> 8);
      uStack_fb6 = (undefined1)((ulong)uVar3 >> 0x10);
      uStack_fb5 = (undefined1)((ulong)uVar3 >> 0x18);
      uStack_fb4 = (undefined1)((ulong)uVar3 >> 0x20);
      uStack_fb3 = (undefined1)((ulong)uVar3 >> 0x28);
      uStack_fb2 = (undefined1)((ulong)uVar3 >> 0x30);
      uStack_fb1 = (undefined1)((ulong)uVar3 >> 0x38);
      uVar6 = CONCAT17(uStack_fb5,
                       CONCAT16(uStack_fa5,
                                CONCAT15(uStack_fb6,
                                         CONCAT14(uStack_fa6,
                                                  CONCAT13(uStack_fb7,
                                                           CONCAT12(uStack_fa7,
                                                                    CONCAT11(local_fb8,(char)uVar2))
                                                          )))));
      uStack_1a20._0_2_ = CONCAT11(uStack_fb4,uStack_fa4);
      uStack_1a20._0_3_ = CONCAT12(uStack_fa3,(undefined2)uStack_1a20);
      uStack_1a20._0_4_ = CONCAT13(uStack_fb3,(undefined3)uStack_1a20);
      uStack_1a20._0_5_ = CONCAT14(uStack_fa2,(undefined4)uStack_1a20);
      uStack_1a20._0_6_ = CONCAT15(uStack_fb2,(undefined5)uStack_1a20);
      uStack_1a20._0_7_ = CONCAT16(uStack_fa1,(undefined6)uStack_1a20);
      uStack_1a20 = CONCAT17(uStack_fb1,(undefined7)uStack_1a20);
      auVar73._8_8_ = uStack_1a20;
      auVar73._0_8_ = uVar6;
      auVar81 = pmaddubsw(auVar73,auVar77);
      uVar3 = *(undefined8 *)((long)local_1870 + (long)in_EDX);
      uVar4 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * 2));
      uStack_fc7 = (undefined1)((ulong)uVar3 >> 8);
      uStack_fc6 = (undefined1)((ulong)uVar3 >> 0x10);
      uStack_fc5 = (undefined1)((ulong)uVar3 >> 0x18);
      uStack_fc4 = (undefined1)((ulong)uVar3 >> 0x20);
      uStack_fc3 = (undefined1)((ulong)uVar3 >> 0x28);
      uStack_fc2 = (undefined1)((ulong)uVar3 >> 0x30);
      uStack_fc1 = (undefined1)((ulong)uVar3 >> 0x38);
      local_fd8 = (undefined1)uVar4;
      uStack_fd7 = (undefined1)((ulong)uVar4 >> 8);
      uStack_fd6 = (undefined1)((ulong)uVar4 >> 0x10);
      uStack_fd5 = (undefined1)((ulong)uVar4 >> 0x18);
      uStack_fd4 = (undefined1)((ulong)uVar4 >> 0x20);
      uStack_fd3 = (undefined1)((ulong)uVar4 >> 0x28);
      uStack_fd2 = (undefined1)((ulong)uVar4 >> 0x30);
      uStack_fd1 = (undefined1)((ulong)uVar4 >> 0x38);
      local_1a38 = CONCAT17(uStack_fd5,
                            CONCAT16(uStack_fc5,
                                     CONCAT15(uStack_fd6,
                                              CONCAT14(uStack_fc6,
                                                       CONCAT13(uStack_fd7,
                                                                CONCAT12(uStack_fc7,
                                                                         CONCAT11(local_fd8,
                                                                                  (char)uVar3)))))))
      ;
      uStack_1a30._0_2_ = CONCAT11(uStack_fd4,uStack_fc4);
      uStack_1a30._0_3_ = CONCAT12(uStack_fc3,(undefined2)uStack_1a30);
      uStack_1a30._0_4_ = CONCAT13(uStack_fd3,(undefined3)uStack_1a30);
      uStack_1a30._0_5_ = CONCAT14(uStack_fc2,(undefined4)uStack_1a30);
      uStack_1a30._0_6_ = CONCAT15(uStack_fd2,(undefined5)uStack_1a30);
      uStack_1a30._0_7_ = CONCAT16(uStack_fc1,(undefined6)uStack_1a30);
      uStack_1a30 = CONCAT17(uStack_fd1,(undefined7)uStack_1a30);
      auVar72._8_8_ = uStack_1a30;
      auVar72._0_8_ = local_1a38;
      auVar82 = pmaddubsw(auVar72,auVar78);
      uVar4 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * 3));
      uVar5 = *(undefined8 *)((long)local_1870 + (long)(in_EDX << 2));
      local_fe8 = (undefined1)uVar4;
      uStack_fe7 = (undefined1)((ulong)uVar4 >> 8);
      uStack_fe6 = (undefined1)((ulong)uVar4 >> 0x10);
      uStack_fe5 = (undefined1)((ulong)uVar4 >> 0x18);
      uStack_fe4 = (undefined1)((ulong)uVar4 >> 0x20);
      uStack_fe3 = (undefined1)((ulong)uVar4 >> 0x28);
      uStack_fe2 = (undefined1)((ulong)uVar4 >> 0x30);
      uStack_fe1 = (undefined1)((ulong)uVar4 >> 0x38);
      local_ff8 = (undefined1)uVar5;
      uStack_ff7 = (undefined1)((ulong)uVar5 >> 8);
      uStack_ff6 = (undefined1)((ulong)uVar5 >> 0x10);
      uStack_ff5 = (undefined1)((ulong)uVar5 >> 0x18);
      uStack_ff4 = (undefined1)((ulong)uVar5 >> 0x20);
      uStack_ff3 = (undefined1)((ulong)uVar5 >> 0x28);
      uStack_ff2 = (undefined1)((ulong)uVar5 >> 0x30);
      uStack_ff1 = (undefined1)((ulong)uVar5 >> 0x38);
      local_1a48 = local_fe8;
      uStack_1a47 = local_ff8;
      uStack_1a46 = uStack_fe7;
      uStack_1a45 = uStack_ff7;
      uStack_1a44 = uStack_fe6;
      uStack_1a43 = uStack_ff6;
      uStack_1a42 = uStack_fe5;
      uStack_1a41 = uStack_ff5;
      uStack_1a40 = uStack_fe4;
      uStack_1a3f = uStack_ff4;
      uStack_1a3e = uStack_fe3;
      uStack_1a3d = uStack_ff3;
      uStack_1a3c = uStack_fe2;
      uStack_1a3b = uStack_ff2;
      uStack_1a3a = uStack_fe1;
      uStack_1a39 = uStack_ff1;
      auVar71[1] = local_ff8;
      auVar71[0] = local_fe8;
      auVar71[2] = uStack_fe7;
      auVar71[3] = uStack_ff7;
      auVar71[4] = uStack_fe6;
      auVar71[5] = uStack_ff6;
      auVar71[6] = uStack_fe5;
      auVar71[7] = uStack_ff5;
      auVar71[9] = uStack_ff4;
      auVar71[8] = uStack_fe4;
      auVar71[10] = uStack_fe3;
      auVar71[0xb] = uStack_ff3;
      auVar71[0xc] = uStack_fe2;
      auVar71[0xd] = uStack_ff2;
      auVar71[0xe] = uStack_fe1;
      auVar71[0xf] = uStack_ff1;
      auVar83 = pmaddubsw(auVar71,auVar79);
      local_188 = auVar80._0_2_;
      sStack_186 = auVar80._2_2_;
      sStack_184 = auVar80._4_2_;
      sStack_182 = auVar80._6_2_;
      sStack_180 = auVar80._8_2_;
      sStack_17e = auVar80._10_2_;
      sStack_17c = auVar80._12_2_;
      sStack_17a = auVar80._14_2_;
      local_198 = auVar81._0_2_;
      sStack_196 = auVar81._2_2_;
      sStack_194 = auVar81._4_2_;
      sStack_192 = auVar81._6_2_;
      sStack_190 = auVar81._8_2_;
      sStack_18e = auVar81._10_2_;
      sStack_18c = auVar81._12_2_;
      sStack_18a = auVar81._14_2_;
      local_1a8 = auVar82._0_2_;
      sStack_1a6 = auVar82._2_2_;
      sStack_1a4 = auVar82._4_2_;
      sStack_1a2 = auVar82._6_2_;
      sStack_1a0 = auVar82._8_2_;
      sStack_19e = auVar82._10_2_;
      sStack_19c = auVar82._12_2_;
      sStack_19a = auVar82._14_2_;
      local_1b8 = auVar83._0_2_;
      sStack_1b6 = auVar83._2_2_;
      sStack_1b4 = auVar83._4_2_;
      sStack_1b2 = auVar83._6_2_;
      sStack_1b0 = auVar83._8_2_;
      sStack_1ae = auVar83._10_2_;
      sStack_1ac = auVar83._12_2_;
      sStack_1aa = auVar83._14_2_;
      *local_1878 = CONCAT26(sStack_182 + sStack_192 + sStack_1a2 + sStack_1b2,
                             CONCAT24(sStack_184 + sStack_194 + sStack_1a4 + sStack_1b4,
                                      CONCAT22(sStack_186 + sStack_196 + sStack_1a6 + sStack_1b6,
                                               local_188 + local_198 + local_1a8 + local_1b8)));
      local_1878[1] =
           CONCAT26(sStack_17a + sStack_18a + sStack_19a + sStack_1aa,
                    CONCAT24(sStack_17c + sStack_18c + sStack_19c + sStack_1ac,
                             CONCAT22(sStack_17e + sStack_18e + sStack_19e + sStack_1ae,
                                      sStack_180 + sStack_190 + sStack_1a0 + sStack_1b0)));
      auVar70._8_8_ = uStack_1a20;
      auVar70._0_8_ = uVar6;
      auVar80 = pmaddubsw(auVar70,auVar76);
      auVar69._8_8_ = uStack_1a30;
      auVar69._0_8_ = local_1a38;
      auVar81 = pmaddubsw(auVar69,auVar77);
      auVar68[1] = local_ff8;
      auVar68[0] = local_fe8;
      auVar68[2] = uStack_fe7;
      auVar68[3] = uStack_ff7;
      auVar68[4] = uStack_fe6;
      auVar68[5] = uStack_ff6;
      auVar68[6] = uStack_fe5;
      auVar68[7] = uStack_ff5;
      auVar68[9] = uStack_ff4;
      auVar68[8] = uStack_fe4;
      auVar68[10] = uStack_fe3;
      auVar68[0xb] = uStack_ff3;
      auVar68[0xc] = uStack_fe2;
      auVar68[0xd] = uStack_ff2;
      auVar68[0xe] = uStack_fe1;
      auVar68[0xf] = uStack_ff1;
      auVar82 = pmaddubsw(auVar68,auVar78);
      uVar4 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * 5));
      uVar5 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * 6));
      local_1008 = (undefined1)uVar4;
      uStack_1007 = (undefined1)((ulong)uVar4 >> 8);
      uStack_1006 = (undefined1)((ulong)uVar4 >> 0x10);
      uStack_1005 = (undefined1)((ulong)uVar4 >> 0x18);
      uStack_1004 = (undefined1)((ulong)uVar4 >> 0x20);
      uStack_1003 = (undefined1)((ulong)uVar4 >> 0x28);
      uStack_1002 = (undefined1)((ulong)uVar4 >> 0x30);
      uStack_1001 = (undefined1)((ulong)uVar4 >> 0x38);
      local_1018 = (undefined1)uVar5;
      uStack_1017 = (undefined1)((ulong)uVar5 >> 8);
      uStack_1016 = (undefined1)((ulong)uVar5 >> 0x10);
      uStack_1015 = (undefined1)((ulong)uVar5 >> 0x18);
      uStack_1014 = (undefined1)((ulong)uVar5 >> 0x20);
      uStack_1013 = (undefined1)((ulong)uVar5 >> 0x28);
      uStack_1012 = (undefined1)((ulong)uVar5 >> 0x30);
      uStack_1011 = (undefined1)((ulong)uVar5 >> 0x38);
      local_1a58 = local_1008;
      uStack_1a57 = local_1018;
      uStack_1a56 = uStack_1007;
      uStack_1a55 = uStack_1017;
      uStack_1a54 = uStack_1006;
      uStack_1a53 = uStack_1016;
      uStack_1a52 = uStack_1005;
      uStack_1a51 = uStack_1015;
      uStack_1a50 = uStack_1004;
      uStack_1a4f = uStack_1014;
      uStack_1a4e = uStack_1003;
      uStack_1a4d = uStack_1013;
      uStack_1a4c = uStack_1002;
      uStack_1a4b = uStack_1012;
      uStack_1a4a = uStack_1001;
      uStack_1a49 = uStack_1011;
      auVar67[1] = local_1018;
      auVar67[0] = local_1008;
      auVar67[2] = uStack_1007;
      auVar67[3] = uStack_1017;
      auVar67[4] = uStack_1006;
      auVar67[5] = uStack_1016;
      auVar67[6] = uStack_1005;
      auVar67[7] = uStack_1015;
      auVar67[9] = uStack_1014;
      auVar67[8] = uStack_1004;
      auVar67[10] = uStack_1003;
      auVar67[0xb] = uStack_1013;
      auVar67[0xc] = uStack_1002;
      auVar67[0xd] = uStack_1012;
      auVar67[0xe] = uStack_1001;
      auVar67[0xf] = uStack_1011;
      auVar83 = pmaddubsw(auVar67,auVar79);
      local_1e8 = auVar80._0_2_;
      sStack_1e6 = auVar80._2_2_;
      sStack_1e4 = auVar80._4_2_;
      sStack_1e2 = auVar80._6_2_;
      sStack_1e0 = auVar80._8_2_;
      sStack_1de = auVar80._10_2_;
      sStack_1dc = auVar80._12_2_;
      sStack_1da = auVar80._14_2_;
      local_1f8 = auVar81._0_2_;
      sStack_1f6 = auVar81._2_2_;
      sStack_1f4 = auVar81._4_2_;
      sStack_1f2 = auVar81._6_2_;
      sStack_1f0 = auVar81._8_2_;
      sStack_1ee = auVar81._10_2_;
      sStack_1ec = auVar81._12_2_;
      sStack_1ea = auVar81._14_2_;
      local_208 = auVar82._0_2_;
      sStack_206 = auVar82._2_2_;
      sStack_204 = auVar82._4_2_;
      sStack_202 = auVar82._6_2_;
      sStack_200 = auVar82._8_2_;
      sStack_1fe = auVar82._10_2_;
      sStack_1fc = auVar82._12_2_;
      sStack_1fa = auVar82._14_2_;
      local_218 = auVar83._0_2_;
      sStack_216 = auVar83._2_2_;
      sStack_214 = auVar83._4_2_;
      sStack_212 = auVar83._6_2_;
      sStack_210 = auVar83._8_2_;
      sStack_20e = auVar83._10_2_;
      sStack_20c = auVar83._12_2_;
      sStack_20a = auVar83._14_2_;
      puVar75 = (undefined8 *)((long)local_1878 + (long)(in_ECX * 2) * 2);
      *puVar75 = CONCAT26(sStack_1e2 + sStack_1f2 + sStack_202 + sStack_212,
                          CONCAT24(sStack_1e4 + sStack_1f4 + sStack_204 + sStack_214,
                                   CONCAT22(sStack_1e6 + sStack_1f6 + sStack_206 + sStack_216,
                                            local_1e8 + local_1f8 + local_208 + local_218)));
      puVar75[1] = CONCAT26(sStack_1da + sStack_1ea + sStack_1fa + sStack_20a,
                            CONCAT24(sStack_1dc + sStack_1ec + sStack_1fc + sStack_20c,
                                     CONCAT22(sStack_1de + sStack_1ee + sStack_1fe + sStack_20e,
                                              sStack_1e0 + sStack_1f0 + sStack_200 + sStack_210)));
      auVar66[1] = (char)uVar2;
      auVar66[0] = local_f98;
      auVar66[2] = uStack_f97;
      auVar66[3] = uStack_fa7;
      auVar66[4] = uStack_f96;
      auVar66[5] = uStack_fa6;
      auVar66[6] = uStack_f95;
      auVar66[7] = uStack_fa5;
      uStack_1a60._0_2_ = CONCAT11(uStack_fa4,uStack_f94);
      uStack_1a60._0_3_ = CONCAT12(uStack_f93,(undefined2)uStack_1a60);
      uStack_1a60._0_4_ = CONCAT13(uStack_fa3,(undefined3)uStack_1a60);
      uStack_1a60._0_5_ = CONCAT14(uStack_f92,(undefined4)uStack_1a60);
      uStack_1a60._0_6_ = CONCAT15(uStack_fa2,(undefined5)uStack_1a60);
      uStack_1a60._0_7_ = CONCAT16(uStack_f91,(undefined6)uStack_1a60);
      uStack_1a60 = CONCAT17(uStack_fa1,(undefined7)uStack_1a60);
      auVar66._8_8_ = uStack_1a60;
      auVar80 = pmaddubsw(auVar66,auVar76);
      uVar2 = CONCAT17(uStack_fc5,
                       CONCAT16(uStack_fb5,
                                CONCAT15(uStack_fc6,
                                         CONCAT14(uStack_fb6,
                                                  CONCAT13(uStack_fc7,
                                                           CONCAT12(uStack_fb7,
                                                                    CONCAT11((char)uVar3,local_fb8))
                                                          )))));
      uStack_1a70._0_2_ = CONCAT11(uStack_fc4,uStack_fb4);
      uStack_1a70._0_3_ = CONCAT12(uStack_fb3,(undefined2)uStack_1a70);
      uStack_1a70._0_4_ = CONCAT13(uStack_fc3,(undefined3)uStack_1a70);
      uStack_1a70._0_5_ = CONCAT14(uStack_fb2,(undefined4)uStack_1a70);
      uStack_1a70._0_6_ = CONCAT15(uStack_fc2,(undefined5)uStack_1a70);
      uStack_1a70._0_7_ = CONCAT16(uStack_fb1,(undefined6)uStack_1a70);
      uStack_1a70 = CONCAT17(uStack_fc1,(undefined7)uStack_1a70);
      auVar65._8_8_ = uStack_1a70;
      auVar65._0_8_ = uVar2;
      auVar81 = pmaddubsw(auVar65,auVar77);
      local_1a88 = CONCAT17(uStack_fe5,
                            CONCAT16(uStack_fd5,
                                     CONCAT15(uStack_fe6,
                                              CONCAT14(uStack_fd6,
                                                       CONCAT13(uStack_fe7,
                                                                CONCAT12(uStack_fd7,
                                                                         CONCAT11(local_fe8,
                                                                                  local_fd8)))))));
      uStack_1a80._0_2_ = CONCAT11(uStack_fe4,uStack_fd4);
      uStack_1a80._0_3_ = CONCAT12(uStack_fd3,(undefined2)uStack_1a80);
      uStack_1a80._0_4_ = CONCAT13(uStack_fe3,(undefined3)uStack_1a80);
      uStack_1a80._0_5_ = CONCAT14(uStack_fd2,(undefined4)uStack_1a80);
      uStack_1a80._0_6_ = CONCAT15(uStack_fe2,(undefined5)uStack_1a80);
      uStack_1a80._0_7_ = CONCAT16(uStack_fd1,(undefined6)uStack_1a80);
      uStack_1a80 = CONCAT17(uStack_fe1,(undefined7)uStack_1a80);
      auVar64._8_8_ = uStack_1a80;
      auVar64._0_8_ = local_1a88;
      auVar82 = pmaddubsw(auVar64,auVar78);
      auVar63[1] = local_1008;
      auVar63[0] = local_ff8;
      auVar63[2] = uStack_ff7;
      auVar63[3] = uStack_1007;
      auVar63[4] = uStack_ff6;
      auVar63[5] = uStack_1006;
      auVar63[6] = uStack_ff5;
      auVar63[7] = uStack_1005;
      auVar63[9] = uStack_1004;
      auVar63[8] = uStack_ff4;
      auVar63[10] = uStack_ff3;
      auVar63[0xb] = uStack_1003;
      auVar63[0xc] = uStack_ff2;
      auVar63[0xd] = uStack_1002;
      auVar63[0xe] = uStack_ff1;
      auVar63[0xf] = uStack_1001;
      auVar83 = pmaddubsw(auVar63,auVar79);
      local_248 = auVar80._0_2_;
      sStack_246 = auVar80._2_2_;
      sStack_244 = auVar80._4_2_;
      sStack_242 = auVar80._6_2_;
      sStack_240 = auVar80._8_2_;
      sStack_23e = auVar80._10_2_;
      sStack_23c = auVar80._12_2_;
      sStack_23a = auVar80._14_2_;
      local_258 = auVar81._0_2_;
      sStack_256 = auVar81._2_2_;
      sStack_254 = auVar81._4_2_;
      sStack_252 = auVar81._6_2_;
      sStack_250 = auVar81._8_2_;
      sStack_24e = auVar81._10_2_;
      sStack_24c = auVar81._12_2_;
      sStack_24a = auVar81._14_2_;
      local_268 = auVar82._0_2_;
      sStack_266 = auVar82._2_2_;
      sStack_264 = auVar82._4_2_;
      sStack_262 = auVar82._6_2_;
      sStack_260 = auVar82._8_2_;
      sStack_25e = auVar82._10_2_;
      sStack_25c = auVar82._12_2_;
      sStack_25a = auVar82._14_2_;
      local_278 = auVar83._0_2_;
      sStack_276 = auVar83._2_2_;
      sStack_274 = auVar83._4_2_;
      sStack_272 = auVar83._6_2_;
      sStack_270 = auVar83._8_2_;
      sStack_26e = auVar83._10_2_;
      sStack_26c = auVar83._12_2_;
      sStack_26a = auVar83._14_2_;
      puVar75 = (undefined8 *)((long)local_1878 + (long)in_ECX * 2);
      *puVar75 = CONCAT26(sStack_242 + sStack_252 + sStack_262 + sStack_272,
                          CONCAT24(sStack_244 + sStack_254 + sStack_264 + sStack_274,
                                   CONCAT22(sStack_246 + sStack_256 + sStack_266 + sStack_276,
                                            local_248 + local_258 + local_268 + local_278)));
      puVar75[1] = CONCAT26(sStack_23a + sStack_24a + sStack_25a + sStack_26a,
                            CONCAT24(sStack_23c + sStack_24c + sStack_25c + sStack_26c,
                                     CONCAT22(sStack_23e + sStack_24e + sStack_25e + sStack_26e,
                                              sStack_240 + sStack_250 + sStack_260 + sStack_270)));
      auVar62._8_8_ = uStack_1a70;
      auVar62._0_8_ = uVar2;
      auVar80 = pmaddubsw(auVar62,auVar76);
      auVar61._8_8_ = uStack_1a80;
      auVar61._0_8_ = local_1a88;
      auVar81 = pmaddubsw(auVar61,auVar77);
      auVar60[1] = local_1008;
      auVar60[0] = local_ff8;
      auVar60[2] = uStack_ff7;
      auVar60[3] = uStack_1007;
      auVar60[4] = uStack_ff6;
      auVar60[5] = uStack_1006;
      auVar60[6] = uStack_ff5;
      auVar60[7] = uStack_1005;
      auVar60[9] = uStack_1004;
      auVar60[8] = uStack_ff4;
      auVar60[10] = uStack_ff3;
      auVar60[0xb] = uStack_1003;
      auVar60[0xc] = uStack_ff2;
      auVar60[0xd] = uStack_1002;
      auVar60[0xe] = uStack_ff1;
      auVar60[0xf] = uStack_1001;
      auVar82 = pmaddubsw(auVar60,auVar78);
      local_1a08 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * 7));
      local_10b8 = (undefined1)local_1a08;
      uStack_10b7 = (undefined1)((ulong)local_1a08 >> 8);
      uStack_10b6 = (undefined1)((ulong)local_1a08 >> 0x10);
      uStack_10b5 = (undefined1)((ulong)local_1a08 >> 0x18);
      uStack_10b4 = (undefined1)((ulong)local_1a08 >> 0x20);
      uStack_10b3 = (undefined1)((ulong)local_1a08 >> 0x28);
      uStack_10b2 = (undefined1)((ulong)local_1a08 >> 0x30);
      uStack_10b1 = (undefined1)((ulong)local_1a08 >> 0x38);
      uStack_1aa7 = local_10b8;
      uStack_1aa5 = uStack_10b7;
      uStack_1aa3 = uStack_10b6;
      uStack_1aa1 = uStack_10b5;
      uStack_1a9f = uStack_10b4;
      uStack_1a9d = uStack_10b3;
      uStack_1a9b = uStack_10b2;
      uStack_1a99 = uStack_10b1;
      auVar59[1] = local_10b8;
      auVar59[0] = local_1018;
      auVar59[2] = uStack_1017;
      auVar59[3] = uStack_10b7;
      auVar59[4] = uStack_1016;
      auVar59[5] = uStack_10b6;
      auVar59[6] = uStack_1015;
      auVar59[7] = uStack_10b5;
      auVar59[9] = uStack_10b4;
      auVar59[8] = uStack_1014;
      auVar59[10] = uStack_1013;
      auVar59[0xb] = uStack_10b3;
      auVar59[0xc] = uStack_1012;
      auVar59[0xd] = uStack_10b2;
      auVar59[0xe] = uStack_1011;
      auVar59[0xf] = uStack_10b1;
      auVar83 = pmaddubsw(auVar59,auVar79);
      local_2a8 = auVar80._0_2_;
      sStack_2a6 = auVar80._2_2_;
      sStack_2a4 = auVar80._4_2_;
      sStack_2a2 = auVar80._6_2_;
      sStack_2a0 = auVar80._8_2_;
      sStack_29e = auVar80._10_2_;
      sStack_29c = auVar80._12_2_;
      sStack_29a = auVar80._14_2_;
      local_2b8 = auVar81._0_2_;
      sStack_2b6 = auVar81._2_2_;
      sStack_2b4 = auVar81._4_2_;
      sStack_2b2 = auVar81._6_2_;
      sStack_2b0 = auVar81._8_2_;
      sStack_2ae = auVar81._10_2_;
      sStack_2ac = auVar81._12_2_;
      sStack_2aa = auVar81._14_2_;
      local_2c8 = auVar82._0_2_;
      sStack_2c6 = auVar82._2_2_;
      sStack_2c4 = auVar82._4_2_;
      sStack_2c2 = auVar82._6_2_;
      sStack_2c0 = auVar82._8_2_;
      sStack_2be = auVar82._10_2_;
      sStack_2bc = auVar82._12_2_;
      sStack_2ba = auVar82._14_2_;
      local_2d8 = auVar83._0_2_;
      sStack_2d6 = auVar83._2_2_;
      sStack_2d4 = auVar83._4_2_;
      sStack_2d2 = auVar83._6_2_;
      sStack_2d0 = auVar83._8_2_;
      sStack_2ce = auVar83._10_2_;
      sStack_2cc = auVar83._12_2_;
      sStack_2ca = auVar83._14_2_;
      puVar75 = (undefined8 *)((long)local_1878 + (long)(in_ECX * 3) * 2);
      *puVar75 = CONCAT26(sStack_2a2 + sStack_2b2 + sStack_2c2 + sStack_2d2,
                          CONCAT24(sStack_2a4 + sStack_2b4 + sStack_2c4 + sStack_2d4,
                                   CONCAT22(sStack_2a6 + sStack_2b6 + sStack_2c6 + sStack_2d6,
                                            local_2a8 + local_2b8 + local_2c8 + local_2d8)));
      puVar75[1] = CONCAT26(sStack_29a + sStack_2aa + sStack_2ba + sStack_2ca,
                            CONCAT24(sStack_29c + sStack_2ac + sStack_2bc + sStack_2cc,
                                     CONCAT22(sStack_29e + sStack_2ae + sStack_2be + sStack_2ce,
                                              sStack_2a0 + sStack_2b0 + sStack_2c0 + sStack_2d0)));
      local_1870 = (undefined8 *)((long)local_1870 + (long)(in_EDX << 3));
      local_1878 = (undefined8 *)((long)local_1878 + (long)(in_ECX << 2) * 2);
      for (local_1890 = 4; local_1890 < in_R9D; local_1890 = local_1890 + 4) {
        uVar3 = CONCAT17(uStack_1a41,
                         CONCAT16(uStack_1a42,
                                  CONCAT15(uStack_1a43,
                                           CONCAT14(uStack_1a44,
                                                    CONCAT13(uStack_1a45,
                                                             CONCAT12(uStack_1a46,
                                                                      CONCAT11(uStack_1a47,
                                                                               local_1a48)))))));
        uVar10 = CONCAT17(uStack_1a39,
                          CONCAT16(uStack_1a3a,
                                   CONCAT15(uStack_1a3b,
                                            CONCAT14(uStack_1a3c,
                                                     CONCAT13(uStack_1a3d,
                                                              CONCAT12(uStack_1a3e,
                                                                       CONCAT11(uStack_1a3f,
                                                                                uStack_1a40)))))));
        uVar8 = CONCAT17(uStack_1a51,
                         CONCAT16(uStack_1a52,
                                  CONCAT15(uStack_1a53,
                                           CONCAT14(uStack_1a54,
                                                    CONCAT13(uStack_1a55,
                                                             CONCAT12(uStack_1a56,
                                                                      CONCAT11(uStack_1a57,
                                                                               local_1a58)))))));
        uVar9 = CONCAT17(uStack_1a49,
                         CONCAT16(uStack_1a4a,
                                  CONCAT15(uStack_1a4b,
                                           CONCAT14(uStack_1a4c,
                                                    CONCAT13(uStack_1a4d,
                                                             CONCAT12(uStack_1a4e,
                                                                      CONCAT11(uStack_1a4f,
                                                                               uStack_1a50)))))));
        auVar58._8_8_ = uStack_1a30;
        auVar58._0_8_ = local_1a38;
        auVar80 = pmaddubsw(auVar58,auVar76);
        auVar57._8_8_ = uVar10;
        auVar57._0_8_ = uVar3;
        auVar81 = pmaddubsw(auVar57,auVar77);
        auVar56._8_8_ = uVar9;
        auVar56._0_8_ = uVar8;
        auVar82 = pmaddubsw(auVar56,auVar78);
        uVar2 = *local_1870;
        local_10c8 = (undefined1)local_1a08;
        local_1a48 = local_10c8;
        uStack_10c7 = (undefined1)((ulong)local_1a08 >> 8);
        uStack_1a46 = uStack_10c7;
        uStack_10c6 = (undefined1)((ulong)local_1a08 >> 0x10);
        uStack_1a44 = uStack_10c6;
        uStack_10c5 = (undefined1)((ulong)local_1a08 >> 0x18);
        uStack_1a42 = uStack_10c5;
        uStack_10c4 = (undefined1)((ulong)local_1a08 >> 0x20);
        uStack_1a40 = uStack_10c4;
        uStack_10c3 = (undefined1)((ulong)local_1a08 >> 0x28);
        uStack_1a3e = uStack_10c3;
        uStack_10c2 = (undefined1)((ulong)local_1a08 >> 0x30);
        uStack_1a3c = uStack_10c2;
        uStack_10c1 = (undefined1)((ulong)local_1a08 >> 0x38);
        uStack_1a3a = uStack_10c1;
        local_10d8 = (undefined1)uVar2;
        uStack_10d7 = (undefined1)((ulong)uVar2 >> 8);
        uStack_10d6 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_10d5 = (undefined1)((ulong)uVar2 >> 0x18);
        uStack_10d4 = (undefined1)((ulong)uVar2 >> 0x20);
        uStack_10d3 = (undefined1)((ulong)uVar2 >> 0x28);
        uStack_10d2 = (undefined1)((ulong)uVar2 >> 0x30);
        uStack_10d1 = (undefined1)((ulong)uVar2 >> 0x38);
        auVar55[1] = local_10d8;
        auVar55[0] = local_10c8;
        auVar55[2] = uStack_10c7;
        auVar55[3] = uStack_10d7;
        auVar55[4] = uStack_10c6;
        auVar55[5] = uStack_10d6;
        auVar55[6] = uStack_10c5;
        auVar55[7] = uStack_10d5;
        auVar55[9] = uStack_10d4;
        auVar55[8] = uStack_10c4;
        auVar55[10] = uStack_10c3;
        auVar55[0xb] = uStack_10d3;
        auVar55[0xc] = uStack_10c2;
        auVar55[0xd] = uStack_10d2;
        auVar55[0xe] = uStack_10c1;
        auVar55[0xf] = uStack_10d1;
        auVar83 = pmaddubsw(auVar55,auVar79);
        uVar6 = CONCAT17(uStack_1a52,
                         CONCAT16(uStack_1a41,
                                  CONCAT15(uStack_1a54,
                                           CONCAT14(uStack_1a43,
                                                    CONCAT13(uStack_1a56,
                                                             CONCAT12(uStack_1a45,
                                                                      CONCAT11(local_1a58,
                                                                               uStack_1a47)))))));
        uVar7 = CONCAT17(uStack_1a4a,
                         CONCAT16(uStack_1a39,
                                  CONCAT15(uStack_1a4c,
                                           CONCAT14(uStack_1a3b,
                                                    CONCAT13(uStack_1a4e,
                                                             CONCAT12(uStack_1a3d,
                                                                      CONCAT11(uStack_1a50,
                                                                               uStack_1a3f)))))));
        uVar4 = CONCAT17(uStack_1aa1,
                         CONCAT16(uStack_1a51,
                                  CONCAT15(uStack_1aa3,
                                           CONCAT14(uStack_1a53,
                                                    CONCAT13(uStack_1aa5,
                                                             CONCAT12(uStack_1a55,
                                                                      CONCAT11(uStack_1aa7,
                                                                               uStack_1a57)))))));
        uVar5 = CONCAT17(uStack_1a99,
                         CONCAT16(uStack_1a49,
                                  CONCAT15(uStack_1a9b,
                                           CONCAT14(uStack_1a4b,
                                                    CONCAT13(uStack_1a9d,
                                                             CONCAT12(uStack_1a4d,
                                                                      CONCAT11(uStack_1a9f,
                                                                               uStack_1a4f)))))));
        local_308 = auVar80._0_2_;
        sStack_306 = auVar80._2_2_;
        sStack_304 = auVar80._4_2_;
        sStack_302 = auVar80._6_2_;
        sStack_300 = auVar80._8_2_;
        sStack_2fe = auVar80._10_2_;
        sStack_2fc = auVar80._12_2_;
        sStack_2fa = auVar80._14_2_;
        local_318 = auVar81._0_2_;
        sStack_316 = auVar81._2_2_;
        sStack_314 = auVar81._4_2_;
        sStack_312 = auVar81._6_2_;
        sStack_310 = auVar81._8_2_;
        sStack_30e = auVar81._10_2_;
        sStack_30c = auVar81._12_2_;
        sStack_30a = auVar81._14_2_;
        local_328 = auVar82._0_2_;
        sStack_326 = auVar82._2_2_;
        sStack_324 = auVar82._4_2_;
        sStack_322 = auVar82._6_2_;
        sStack_320 = auVar82._8_2_;
        sStack_31e = auVar82._10_2_;
        sStack_31c = auVar82._12_2_;
        sStack_31a = auVar82._14_2_;
        local_338 = auVar83._0_2_;
        sStack_336 = auVar83._2_2_;
        sStack_334 = auVar83._4_2_;
        sStack_332 = auVar83._6_2_;
        sStack_330 = auVar83._8_2_;
        sStack_32e = auVar83._10_2_;
        sStack_32c = auVar83._12_2_;
        sStack_32a = auVar83._14_2_;
        *local_1878 = CONCAT26(sStack_302 + sStack_312 + sStack_322 + sStack_332,
                               CONCAT24(sStack_304 + sStack_314 + sStack_324 + sStack_334,
                                        CONCAT22(sStack_306 + sStack_316 + sStack_326 + sStack_336,
                                                 local_308 + local_318 + local_328 + local_338)));
        local_1878[1] =
             CONCAT26(sStack_2fa + sStack_30a + sStack_31a + sStack_32a,
                      CONCAT24(sStack_2fc + sStack_30c + sStack_31c + sStack_32c,
                               CONCAT22(sStack_2fe + sStack_30e + sStack_31e + sStack_32e,
                                        sStack_300 + sStack_310 + sStack_320 + sStack_330)));
        auVar54._8_8_ = uVar10;
        auVar54._0_8_ = uVar3;
        auVar80 = pmaddubsw(auVar54,auVar76);
        auVar53._8_8_ = uVar9;
        auVar53._0_8_ = uVar8;
        auVar81 = pmaddubsw(auVar53,auVar77);
        auVar52[1] = local_10d8;
        auVar52[0] = local_10c8;
        auVar52[2] = uStack_10c7;
        auVar52[3] = uStack_10d7;
        auVar52[4] = uStack_10c6;
        auVar52[5] = uStack_10d6;
        auVar52[6] = uStack_10c5;
        auVar52[7] = uStack_10d5;
        auVar52[9] = uStack_10d4;
        auVar52[8] = uStack_10c4;
        auVar52[10] = uStack_10c3;
        auVar52[0xb] = uStack_10d3;
        auVar52[0xc] = uStack_10c2;
        auVar52[0xd] = uStack_10d2;
        auVar52[0xe] = uStack_10c1;
        auVar52[0xf] = uStack_10d1;
        auVar82 = pmaddubsw(auVar52,auVar78);
        uVar2 = *(undefined8 *)((long)local_1870 + (long)in_EDX);
        uVar3 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * 2));
        local_10e8 = (undefined1)uVar2;
        local_1a58 = local_10e8;
        uStack_10e7 = (undefined1)((ulong)uVar2 >> 8);
        uStack_1a56 = uStack_10e7;
        uStack_10e6 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_1a54 = uStack_10e6;
        uStack_10e5 = (undefined1)((ulong)uVar2 >> 0x18);
        uStack_1a52 = uStack_10e5;
        uStack_10e4 = (undefined1)((ulong)uVar2 >> 0x20);
        uStack_1a50 = uStack_10e4;
        uStack_10e3 = (undefined1)((ulong)uVar2 >> 0x28);
        uStack_1a4e = uStack_10e3;
        uStack_10e2 = (undefined1)((ulong)uVar2 >> 0x30);
        uStack_1a4c = uStack_10e2;
        uStack_10e1 = (undefined1)((ulong)uVar2 >> 0x38);
        uStack_1a4a = uStack_10e1;
        local_10f8 = (undefined1)uVar3;
        uStack_1a57 = local_10f8;
        uStack_10f7 = (undefined1)((ulong)uVar3 >> 8);
        uStack_1a55 = uStack_10f7;
        uStack_10f6 = (undefined1)((ulong)uVar3 >> 0x10);
        uStack_1a53 = uStack_10f6;
        uStack_10f5 = (undefined1)((ulong)uVar3 >> 0x18);
        uStack_1a51 = uStack_10f5;
        uStack_10f4 = (undefined1)((ulong)uVar3 >> 0x20);
        uStack_1a4f = uStack_10f4;
        uStack_10f3 = (undefined1)((ulong)uVar3 >> 0x28);
        uStack_1a4d = uStack_10f3;
        uStack_10f2 = (undefined1)((ulong)uVar3 >> 0x30);
        uStack_1a4b = uStack_10f2;
        uStack_10f1 = (undefined1)((ulong)uVar3 >> 0x38);
        uStack_1a49 = uStack_10f1;
        auVar51[1] = local_10f8;
        auVar51[0] = local_10e8;
        auVar51[2] = uStack_10e7;
        auVar51[3] = uStack_10f7;
        auVar51[4] = uStack_10e6;
        auVar51[5] = uStack_10f6;
        auVar51[6] = uStack_10e5;
        auVar51[7] = uStack_10f5;
        auVar51[9] = uStack_10f4;
        auVar51[8] = uStack_10e4;
        auVar51[10] = uStack_10e3;
        auVar51[0xb] = uStack_10f3;
        auVar51[0xc] = uStack_10e2;
        auVar51[0xd] = uStack_10f2;
        auVar51[0xe] = uStack_10e1;
        auVar51[0xf] = uStack_10f1;
        auVar83 = pmaddubsw(auVar51,auVar79);
        local_368 = auVar80._0_2_;
        sStack_366 = auVar80._2_2_;
        sStack_364 = auVar80._4_2_;
        sStack_362 = auVar80._6_2_;
        sStack_360 = auVar80._8_2_;
        sStack_35e = auVar80._10_2_;
        sStack_35c = auVar80._12_2_;
        sStack_35a = auVar80._14_2_;
        local_378 = auVar81._0_2_;
        sStack_376 = auVar81._2_2_;
        sStack_374 = auVar81._4_2_;
        sStack_372 = auVar81._6_2_;
        sStack_370 = auVar81._8_2_;
        sStack_36e = auVar81._10_2_;
        sStack_36c = auVar81._12_2_;
        sStack_36a = auVar81._14_2_;
        local_388 = auVar82._0_2_;
        sStack_386 = auVar82._2_2_;
        sStack_384 = auVar82._4_2_;
        sStack_382 = auVar82._6_2_;
        sStack_380 = auVar82._8_2_;
        sStack_37e = auVar82._10_2_;
        sStack_37c = auVar82._12_2_;
        sStack_37a = auVar82._14_2_;
        local_398 = auVar83._0_2_;
        sStack_396 = auVar83._2_2_;
        sStack_394 = auVar83._4_2_;
        sStack_392 = auVar83._6_2_;
        sStack_390 = auVar83._8_2_;
        sStack_38e = auVar83._10_2_;
        sStack_38c = auVar83._12_2_;
        sStack_38a = auVar83._14_2_;
        puVar75 = (undefined8 *)((long)local_1878 + (long)(in_ECX * 2) * 2);
        *puVar75 = CONCAT26(sStack_362 + sStack_372 + sStack_382 + sStack_392,
                            CONCAT24(sStack_364 + sStack_374 + sStack_384 + sStack_394,
                                     CONCAT22(sStack_366 + sStack_376 + sStack_386 + sStack_396,
                                              local_368 + local_378 + local_388 + local_398)));
        puVar75[1] = CONCAT26(sStack_35a + sStack_36a + sStack_37a + sStack_38a,
                              CONCAT24(sStack_35c + sStack_36c + sStack_37c + sStack_38c,
                                       CONCAT22(sStack_35e + sStack_36e + sStack_37e + sStack_38e,
                                                sStack_360 + sStack_370 + sStack_380 + sStack_390)))
        ;
        auVar50._8_8_ = uStack_1a80;
        auVar50._0_8_ = local_1a88;
        auVar80 = pmaddubsw(auVar50,auVar76);
        auVar49._8_8_ = uVar7;
        auVar49._0_8_ = uVar6;
        auVar81 = pmaddubsw(auVar49,auVar77);
        auVar48._8_8_ = uVar5;
        auVar48._0_8_ = uVar4;
        auVar82 = pmaddubsw(auVar48,auVar78);
        auVar47[1] = local_10e8;
        auVar47[0] = local_10d8;
        auVar47[2] = uStack_10d7;
        auVar47[3] = uStack_10e7;
        auVar47[4] = uStack_10d6;
        auVar47[5] = uStack_10e6;
        auVar47[6] = uStack_10d5;
        auVar47[7] = uStack_10e5;
        auVar47[9] = uStack_10e4;
        auVar47[8] = uStack_10d4;
        auVar47[10] = uStack_10d3;
        auVar47[0xb] = uStack_10e3;
        auVar47[0xc] = uStack_10d2;
        auVar47[0xd] = uStack_10e2;
        auVar47[0xe] = uStack_10d1;
        auVar47[0xf] = uStack_10e1;
        auVar83 = pmaddubsw(auVar47,auVar79);
        local_3c8 = auVar80._0_2_;
        sStack_3c6 = auVar80._2_2_;
        sStack_3c4 = auVar80._4_2_;
        sStack_3c2 = auVar80._6_2_;
        sStack_3c0 = auVar80._8_2_;
        sStack_3be = auVar80._10_2_;
        sStack_3bc = auVar80._12_2_;
        sStack_3ba = auVar80._14_2_;
        local_3d8 = auVar81._0_2_;
        sStack_3d6 = auVar81._2_2_;
        sStack_3d4 = auVar81._4_2_;
        sStack_3d2 = auVar81._6_2_;
        sStack_3d0 = auVar81._8_2_;
        sStack_3ce = auVar81._10_2_;
        sStack_3cc = auVar81._12_2_;
        sStack_3ca = auVar81._14_2_;
        local_3e8 = auVar82._0_2_;
        sStack_3e6 = auVar82._2_2_;
        sStack_3e4 = auVar82._4_2_;
        sStack_3e2 = auVar82._6_2_;
        sStack_3e0 = auVar82._8_2_;
        sStack_3de = auVar82._10_2_;
        sStack_3dc = auVar82._12_2_;
        sStack_3da = auVar82._14_2_;
        local_3f8 = auVar83._0_2_;
        sStack_3f6 = auVar83._2_2_;
        sStack_3f4 = auVar83._4_2_;
        sStack_3f2 = auVar83._6_2_;
        sStack_3f0 = auVar83._8_2_;
        sStack_3ee = auVar83._10_2_;
        sStack_3ec = auVar83._12_2_;
        sStack_3ea = auVar83._14_2_;
        puVar75 = (undefined8 *)((long)local_1878 + (long)in_ECX * 2);
        *puVar75 = CONCAT26(sStack_3c2 + sStack_3d2 + sStack_3e2 + sStack_3f2,
                            CONCAT24(sStack_3c4 + sStack_3d4 + sStack_3e4 + sStack_3f4,
                                     CONCAT22(sStack_3c6 + sStack_3d6 + sStack_3e6 + sStack_3f6,
                                              local_3c8 + local_3d8 + local_3e8 + local_3f8)));
        puVar75[1] = CONCAT26(sStack_3ba + sStack_3ca + sStack_3da + sStack_3ea,
                              CONCAT24(sStack_3bc + sStack_3cc + sStack_3dc + sStack_3ec,
                                       CONCAT22(sStack_3be + sStack_3ce + sStack_3de + sStack_3ee,
                                                sStack_3c0 + sStack_3d0 + sStack_3e0 + sStack_3f0)))
        ;
        auVar46._8_8_ = uVar7;
        auVar46._0_8_ = uVar6;
        auVar80 = pmaddubsw(auVar46,auVar76);
        auVar45._8_8_ = uVar5;
        auVar45._0_8_ = uVar4;
        auVar81 = pmaddubsw(auVar45,auVar77);
        auVar44[1] = local_10e8;
        auVar44[0] = local_10d8;
        auVar44[2] = uStack_10d7;
        auVar44[3] = uStack_10e7;
        auVar44[4] = uStack_10d6;
        auVar44[5] = uStack_10e6;
        auVar44[6] = uStack_10d5;
        auVar44[7] = uStack_10e5;
        auVar44[9] = uStack_10e4;
        auVar44[8] = uStack_10d4;
        auVar44[10] = uStack_10d3;
        auVar44[0xb] = uStack_10e3;
        auVar44[0xc] = uStack_10d2;
        auVar44[0xd] = uStack_10e2;
        auVar44[0xe] = uStack_10d1;
        auVar44[0xf] = uStack_10e1;
        auVar82 = pmaddubsw(auVar44,auVar78);
        local_1a08 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * 3));
        local_1138 = (undefined1)local_1a08;
        uStack_1aa7 = local_1138;
        uStack_1137 = (undefined1)((ulong)local_1a08 >> 8);
        uStack_1aa5 = uStack_1137;
        uStack_1136 = (undefined1)((ulong)local_1a08 >> 0x10);
        uStack_1aa3 = uStack_1136;
        uStack_1135 = (undefined1)((ulong)local_1a08 >> 0x18);
        uStack_1aa1 = uStack_1135;
        uStack_1134 = (undefined1)((ulong)local_1a08 >> 0x20);
        uStack_1a9f = uStack_1134;
        uStack_1133 = (undefined1)((ulong)local_1a08 >> 0x28);
        uStack_1a9d = uStack_1133;
        uStack_1132 = (undefined1)((ulong)local_1a08 >> 0x30);
        uStack_1a9b = uStack_1132;
        uStack_1131 = (undefined1)((ulong)local_1a08 >> 0x38);
        uStack_1a99 = uStack_1131;
        auVar43[1] = local_1138;
        auVar43[0] = local_10f8;
        auVar43[2] = uStack_10f7;
        auVar43[3] = uStack_1137;
        auVar43[4] = uStack_10f6;
        auVar43[5] = uStack_1136;
        auVar43[6] = uStack_10f5;
        auVar43[7] = uStack_1135;
        auVar43[9] = uStack_1134;
        auVar43[8] = uStack_10f4;
        auVar43[10] = uStack_10f3;
        auVar43[0xb] = uStack_1133;
        auVar43[0xc] = uStack_10f2;
        auVar43[0xd] = uStack_1132;
        auVar43[0xe] = uStack_10f1;
        auVar43[0xf] = uStack_1131;
        auVar83 = pmaddubsw(auVar43,auVar79);
        local_428 = auVar80._0_2_;
        sStack_426 = auVar80._2_2_;
        sStack_424 = auVar80._4_2_;
        sStack_422 = auVar80._6_2_;
        sStack_420 = auVar80._8_2_;
        sStack_41e = auVar80._10_2_;
        sStack_41c = auVar80._12_2_;
        sStack_41a = auVar80._14_2_;
        local_438 = auVar81._0_2_;
        sStack_436 = auVar81._2_2_;
        sStack_434 = auVar81._4_2_;
        sStack_432 = auVar81._6_2_;
        sStack_430 = auVar81._8_2_;
        sStack_42e = auVar81._10_2_;
        sStack_42c = auVar81._12_2_;
        sStack_42a = auVar81._14_2_;
        local_448 = auVar82._0_2_;
        sStack_446 = auVar82._2_2_;
        sStack_444 = auVar82._4_2_;
        sStack_442 = auVar82._6_2_;
        sStack_440 = auVar82._8_2_;
        sStack_43e = auVar82._10_2_;
        sStack_43c = auVar82._12_2_;
        sStack_43a = auVar82._14_2_;
        local_458 = auVar83._0_2_;
        sStack_456 = auVar83._2_2_;
        sStack_454 = auVar83._4_2_;
        sStack_452 = auVar83._6_2_;
        sStack_450 = auVar83._8_2_;
        sStack_44e = auVar83._10_2_;
        sStack_44c = auVar83._12_2_;
        sStack_44a = auVar83._14_2_;
        puVar75 = (undefined8 *)((long)local_1878 + (long)(in_ECX * 3) * 2);
        *puVar75 = CONCAT26(sStack_422 + sStack_432 + sStack_442 + sStack_452,
                            CONCAT24(sStack_424 + sStack_434 + sStack_444 + sStack_454,
                                     CONCAT22(sStack_426 + sStack_436 + sStack_446 + sStack_456,
                                              local_428 + local_438 + local_448 + local_458)));
        puVar75[1] = CONCAT26(sStack_41a + sStack_42a + sStack_43a + sStack_44a,
                              CONCAT24(sStack_41c + sStack_42c + sStack_43c + sStack_44c,
                                       CONCAT22(sStack_41e + sStack_42e + sStack_43e + sStack_44e,
                                                sStack_420 + sStack_430 + sStack_440 + sStack_450)))
        ;
        local_1870 = (undefined8 *)((long)local_1870 + (long)(in_EDX << 2));
        local_1878 = (undefined8 *)((long)local_1878 + (long)(in_ECX << 2) * 2);
        local_1a88 = uVar4;
        uStack_1a80 = uVar5;
        uStack_1a47 = local_10d8;
        uStack_1a45 = uStack_10d7;
        uStack_1a43 = uStack_10d6;
        uStack_1a41 = uStack_10d5;
        uStack_1a3f = uStack_10d4;
        uStack_1a3d = uStack_10d3;
        uStack_1a3b = uStack_10d2;
        uStack_1a39 = uStack_10d1;
        local_1a38 = uVar8;
        uStack_1a30 = uVar9;
      }
    }
  }
  else {
    for (local_1894 = 0; local_1894 < (int)s32_8x16b[1]; local_1894 = local_1894 + 4) {
      local_1870 = (undefined8 *)(in_RDI + local_1894);
      local_1878 = (undefined8 *)(in_RSI + (long)local_1894 * 2);
      uVar2 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * -3));
      uVar3 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * -2));
      uStack_1147 = (undefined1)((ulong)uVar2 >> 8);
      uStack_1146 = (undefined1)((ulong)uVar2 >> 0x10);
      uStack_1145 = (undefined1)((ulong)uVar2 >> 0x18);
      uStack_1144 = (undefined1)((ulong)uVar2 >> 0x20);
      uStack_1143 = (undefined1)((ulong)uVar2 >> 0x28);
      uStack_1142 = (undefined1)((ulong)uVar2 >> 0x30);
      uStack_1141 = (undefined1)((ulong)uVar2 >> 0x38);
      local_1158 = (undefined1)uVar3;
      uStack_1157 = (undefined1)((ulong)uVar3 >> 8);
      uStack_1156 = (undefined1)((ulong)uVar3 >> 0x10);
      uStack_1155 = (undefined1)((ulong)uVar3 >> 0x18);
      uStack_1154 = (undefined1)((ulong)uVar3 >> 0x20);
      uStack_1153 = (undefined1)((ulong)uVar3 >> 0x28);
      uStack_1152 = (undefined1)((ulong)uVar3 >> 0x30);
      uStack_1151 = (undefined1)((ulong)uVar3 >> 0x38);
      auVar42[1] = local_1158;
      auVar42[0] = (char)uVar2;
      auVar42[2] = uStack_1147;
      auVar42[3] = uStack_1157;
      auVar42[4] = uStack_1146;
      auVar42[5] = uStack_1156;
      auVar42[6] = uStack_1145;
      auVar42[7] = uStack_1155;
      uStack_1a10._0_2_ = CONCAT11(uStack_1154,uStack_1144);
      uStack_1a10._0_3_ = CONCAT12(uStack_1143,(undefined2)uStack_1a10);
      uStack_1a10._0_4_ = CONCAT13(uStack_1153,(undefined3)uStack_1a10);
      uStack_1a10._0_5_ = CONCAT14(uStack_1142,(undefined4)uStack_1a10);
      uStack_1a10._0_6_ = CONCAT15(uStack_1152,(undefined5)uStack_1a10);
      uStack_1a10._0_7_ = CONCAT16(uStack_1141,(undefined6)uStack_1a10);
      uStack_1a10 = CONCAT17(uStack_1151,(undefined7)uStack_1a10);
      auVar42._8_8_ = uStack_1a10;
      auVar80 = pmaddubsw(auVar42,auVar76);
      uVar2 = *(undefined8 *)((long)local_1870 + (long)-in_EDX);
      uVar3 = *local_1870;
      uStack_1167 = (undefined1)((ulong)uVar2 >> 8);
      uStack_1166 = (undefined1)((ulong)uVar2 >> 0x10);
      uStack_1165 = (undefined1)((ulong)uVar2 >> 0x18);
      uStack_1164 = (undefined1)((ulong)uVar2 >> 0x20);
      uStack_1163 = (undefined1)((ulong)uVar2 >> 0x28);
      uStack_1162 = (undefined1)((ulong)uVar2 >> 0x30);
      uStack_1161 = (undefined1)((ulong)uVar2 >> 0x38);
      local_1178 = (undefined1)uVar3;
      uStack_1177 = (undefined1)((ulong)uVar3 >> 8);
      uStack_1176 = (undefined1)((ulong)uVar3 >> 0x10);
      uStack_1175 = (undefined1)((ulong)uVar3 >> 0x18);
      uStack_1174 = (undefined1)((ulong)uVar3 >> 0x20);
      uStack_1173 = (undefined1)((ulong)uVar3 >> 0x28);
      uStack_1172 = (undefined1)((ulong)uVar3 >> 0x30);
      uStack_1171 = (undefined1)((ulong)uVar3 >> 0x38);
      uVar6 = CONCAT17(uStack_1175,
                       CONCAT16(uStack_1165,
                                CONCAT15(uStack_1176,
                                         CONCAT14(uStack_1166,
                                                  CONCAT13(uStack_1177,
                                                           CONCAT12(uStack_1167,
                                                                    CONCAT11(local_1178,(char)uVar2)
                                                                   ))))));
      uStack_1a20._0_2_ = CONCAT11(uStack_1174,uStack_1164);
      uStack_1a20._0_3_ = CONCAT12(uStack_1163,(undefined2)uStack_1a20);
      uStack_1a20._0_4_ = CONCAT13(uStack_1173,(undefined3)uStack_1a20);
      uStack_1a20._0_5_ = CONCAT14(uStack_1162,(undefined4)uStack_1a20);
      uStack_1a20._0_6_ = CONCAT15(uStack_1172,(undefined5)uStack_1a20);
      uStack_1a20._0_7_ = CONCAT16(uStack_1161,(undefined6)uStack_1a20);
      uStack_1a20 = CONCAT17(uStack_1171,(undefined7)uStack_1a20);
      auVar41._8_8_ = uStack_1a20;
      auVar41._0_8_ = uVar6;
      auVar81 = pmaddubsw(auVar41,auVar77);
      uVar3 = *(undefined8 *)((long)local_1870 + (long)in_EDX);
      uVar4 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * 2));
      uStack_1187 = (undefined1)((ulong)uVar3 >> 8);
      uStack_1186 = (undefined1)((ulong)uVar3 >> 0x10);
      uStack_1185 = (undefined1)((ulong)uVar3 >> 0x18);
      uStack_1184 = (undefined1)((ulong)uVar3 >> 0x20);
      uStack_1183 = (undefined1)((ulong)uVar3 >> 0x28);
      uStack_1182 = (undefined1)((ulong)uVar3 >> 0x30);
      uStack_1181 = (undefined1)((ulong)uVar3 >> 0x38);
      local_1198 = (undefined1)uVar4;
      uStack_1197 = (undefined1)((ulong)uVar4 >> 8);
      uStack_1196 = (undefined1)((ulong)uVar4 >> 0x10);
      uStack_1195 = (undefined1)((ulong)uVar4 >> 0x18);
      uStack_1194 = (undefined1)((ulong)uVar4 >> 0x20);
      uStack_1193 = (undefined1)((ulong)uVar4 >> 0x28);
      uStack_1192 = (undefined1)((ulong)uVar4 >> 0x30);
      uStack_1191 = (undefined1)((ulong)uVar4 >> 0x38);
      local_1a38 = CONCAT17(uStack_1195,
                            CONCAT16(uStack_1185,
                                     CONCAT15(uStack_1196,
                                              CONCAT14(uStack_1186,
                                                       CONCAT13(uStack_1197,
                                                                CONCAT12(uStack_1187,
                                                                         CONCAT11(local_1198,
                                                                                  (char)uVar3)))))))
      ;
      uStack_1a30._0_2_ = CONCAT11(uStack_1194,uStack_1184);
      uStack_1a30._0_3_ = CONCAT12(uStack_1183,(undefined2)uStack_1a30);
      uStack_1a30._0_4_ = CONCAT13(uStack_1193,(undefined3)uStack_1a30);
      uStack_1a30._0_5_ = CONCAT14(uStack_1182,(undefined4)uStack_1a30);
      uStack_1a30._0_6_ = CONCAT15(uStack_1192,(undefined5)uStack_1a30);
      uStack_1a30._0_7_ = CONCAT16(uStack_1181,(undefined6)uStack_1a30);
      uStack_1a30 = CONCAT17(uStack_1191,(undefined7)uStack_1a30);
      auVar40._8_8_ = uStack_1a30;
      auVar40._0_8_ = local_1a38;
      auVar82 = pmaddubsw(auVar40,auVar78);
      uVar4 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * 3));
      uVar5 = *(undefined8 *)((long)local_1870 + (long)(in_EDX << 2));
      local_11a8 = (undefined1)uVar4;
      uStack_11a7 = (undefined1)((ulong)uVar4 >> 8);
      uStack_11a6 = (undefined1)((ulong)uVar4 >> 0x10);
      uStack_11a5 = (undefined1)((ulong)uVar4 >> 0x18);
      uStack_11a4 = (undefined1)((ulong)uVar4 >> 0x20);
      uStack_11a3 = (undefined1)((ulong)uVar4 >> 0x28);
      uStack_11a2 = (undefined1)((ulong)uVar4 >> 0x30);
      uStack_11a1 = (undefined1)((ulong)uVar4 >> 0x38);
      local_11b8 = (undefined1)uVar5;
      uStack_11b7 = (undefined1)((ulong)uVar5 >> 8);
      uStack_11b6 = (undefined1)((ulong)uVar5 >> 0x10);
      uStack_11b5 = (undefined1)((ulong)uVar5 >> 0x18);
      uStack_11b4 = (undefined1)((ulong)uVar5 >> 0x20);
      uStack_11b3 = (undefined1)((ulong)uVar5 >> 0x28);
      uStack_11b2 = (undefined1)((ulong)uVar5 >> 0x30);
      uStack_11b1 = (undefined1)((ulong)uVar5 >> 0x38);
      local_1a48 = local_11a8;
      uStack_1a47 = local_11b8;
      uStack_1a46 = uStack_11a7;
      uStack_1a45 = uStack_11b7;
      uStack_1a44 = uStack_11a6;
      uStack_1a43 = uStack_11b6;
      uStack_1a42 = uStack_11a5;
      uStack_1a41 = uStack_11b5;
      uStack_1a40 = uStack_11a4;
      uStack_1a3f = uStack_11b4;
      uStack_1a3e = uStack_11a3;
      uStack_1a3d = uStack_11b3;
      uStack_1a3c = uStack_11a2;
      uStack_1a3b = uStack_11b2;
      uStack_1a3a = uStack_11a1;
      uStack_1a39 = uStack_11b1;
      auVar39[1] = local_11b8;
      auVar39[0] = local_11a8;
      auVar39[2] = uStack_11a7;
      auVar39[3] = uStack_11b7;
      auVar39[4] = uStack_11a6;
      auVar39[5] = uStack_11b6;
      auVar39[6] = uStack_11a5;
      auVar39[7] = uStack_11b5;
      auVar39[9] = uStack_11b4;
      auVar39[8] = uStack_11a4;
      auVar39[10] = uStack_11a3;
      auVar39[0xb] = uStack_11b3;
      auVar39[0xc] = uStack_11a2;
      auVar39[0xd] = uStack_11b2;
      auVar39[0xe] = uStack_11a1;
      auVar39[0xf] = uStack_11b1;
      auVar83 = pmaddubsw(auVar39,auVar79);
      local_488 = auVar80._0_2_;
      sStack_486 = auVar80._2_2_;
      sStack_484 = auVar80._4_2_;
      sStack_482 = auVar80._6_2_;
      local_498 = auVar81._0_2_;
      sStack_496 = auVar81._2_2_;
      sStack_494 = auVar81._4_2_;
      sStack_492 = auVar81._6_2_;
      local_4a8 = auVar82._0_2_;
      sStack_4a6 = auVar82._2_2_;
      sStack_4a4 = auVar82._4_2_;
      sStack_4a2 = auVar82._6_2_;
      local_4b8 = auVar83._0_2_;
      sStack_4b6 = auVar83._2_2_;
      sStack_4b4 = auVar83._4_2_;
      sStack_4b2 = auVar83._6_2_;
      *local_1878 = CONCAT26(sStack_482 + sStack_492 + sStack_4a2 + sStack_4b2,
                             CONCAT24(sStack_484 + sStack_494 + sStack_4a4 + sStack_4b4,
                                      CONCAT22(sStack_486 + sStack_496 + sStack_4a6 + sStack_4b6,
                                               local_488 + local_498 + local_4a8 + local_4b8)));
      auVar38._8_8_ = uStack_1a20;
      auVar38._0_8_ = uVar6;
      auVar80 = pmaddubsw(auVar38,auVar76);
      auVar37._8_8_ = uStack_1a30;
      auVar37._0_8_ = local_1a38;
      auVar81 = pmaddubsw(auVar37,auVar77);
      auVar36[1] = local_11b8;
      auVar36[0] = local_11a8;
      auVar36[2] = uStack_11a7;
      auVar36[3] = uStack_11b7;
      auVar36[4] = uStack_11a6;
      auVar36[5] = uStack_11b6;
      auVar36[6] = uStack_11a5;
      auVar36[7] = uStack_11b5;
      auVar36[9] = uStack_11b4;
      auVar36[8] = uStack_11a4;
      auVar36[10] = uStack_11a3;
      auVar36[0xb] = uStack_11b3;
      auVar36[0xc] = uStack_11a2;
      auVar36[0xd] = uStack_11b2;
      auVar36[0xe] = uStack_11a1;
      auVar36[0xf] = uStack_11b1;
      auVar82 = pmaddubsw(auVar36,auVar78);
      uVar4 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * 5));
      uVar5 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * 6));
      local_11c8 = (undefined1)uVar4;
      uStack_11c7 = (undefined1)((ulong)uVar4 >> 8);
      uStack_11c6 = (undefined1)((ulong)uVar4 >> 0x10);
      uStack_11c5 = (undefined1)((ulong)uVar4 >> 0x18);
      uStack_11c4 = (undefined1)((ulong)uVar4 >> 0x20);
      uStack_11c3 = (undefined1)((ulong)uVar4 >> 0x28);
      uStack_11c2 = (undefined1)((ulong)uVar4 >> 0x30);
      uStack_11c1 = (undefined1)((ulong)uVar4 >> 0x38);
      local_11d8 = (undefined1)uVar5;
      uStack_11d7 = (undefined1)((ulong)uVar5 >> 8);
      uStack_11d6 = (undefined1)((ulong)uVar5 >> 0x10);
      uStack_11d5 = (undefined1)((ulong)uVar5 >> 0x18);
      uStack_11d4 = (undefined1)((ulong)uVar5 >> 0x20);
      uStack_11d3 = (undefined1)((ulong)uVar5 >> 0x28);
      uStack_11d2 = (undefined1)((ulong)uVar5 >> 0x30);
      uStack_11d1 = (undefined1)((ulong)uVar5 >> 0x38);
      local_1a58 = local_11c8;
      uStack_1a57 = local_11d8;
      uStack_1a56 = uStack_11c7;
      uStack_1a55 = uStack_11d7;
      uStack_1a54 = uStack_11c6;
      uStack_1a53 = uStack_11d6;
      uStack_1a52 = uStack_11c5;
      uStack_1a51 = uStack_11d5;
      uStack_1a50 = uStack_11c4;
      uStack_1a4f = uStack_11d4;
      uStack_1a4e = uStack_11c3;
      uStack_1a4d = uStack_11d3;
      uStack_1a4c = uStack_11c2;
      uStack_1a4b = uStack_11d2;
      uStack_1a4a = uStack_11c1;
      uStack_1a49 = uStack_11d1;
      auVar35[1] = local_11d8;
      auVar35[0] = local_11c8;
      auVar35[2] = uStack_11c7;
      auVar35[3] = uStack_11d7;
      auVar35[4] = uStack_11c6;
      auVar35[5] = uStack_11d6;
      auVar35[6] = uStack_11c5;
      auVar35[7] = uStack_11d5;
      auVar35[9] = uStack_11d4;
      auVar35[8] = uStack_11c4;
      auVar35[10] = uStack_11c3;
      auVar35[0xb] = uStack_11d3;
      auVar35[0xc] = uStack_11c2;
      auVar35[0xd] = uStack_11d2;
      auVar35[0xe] = uStack_11c1;
      auVar35[0xf] = uStack_11d1;
      auVar83 = pmaddubsw(auVar35,auVar79);
      local_4e8 = auVar80._0_2_;
      sStack_4e6 = auVar80._2_2_;
      sStack_4e4 = auVar80._4_2_;
      sStack_4e2 = auVar80._6_2_;
      local_4f8 = auVar81._0_2_;
      sStack_4f6 = auVar81._2_2_;
      sStack_4f4 = auVar81._4_2_;
      sStack_4f2 = auVar81._6_2_;
      local_508 = auVar82._0_2_;
      sStack_506 = auVar82._2_2_;
      sStack_504 = auVar82._4_2_;
      sStack_502 = auVar82._6_2_;
      local_518 = auVar83._0_2_;
      sStack_516 = auVar83._2_2_;
      sStack_514 = auVar83._4_2_;
      sStack_512 = auVar83._6_2_;
      *(ulong *)((long)local_1878 + (long)(in_ECX * 2) * 2) =
           CONCAT26(sStack_4e2 + sStack_4f2 + sStack_502 + sStack_512,
                    CONCAT24(sStack_4e4 + sStack_4f4 + sStack_504 + sStack_514,
                             CONCAT22(sStack_4e6 + sStack_4f6 + sStack_506 + sStack_516,
                                      local_4e8 + local_4f8 + local_508 + local_518)));
      auVar34[1] = (char)uVar2;
      auVar34[0] = local_1158;
      auVar34[2] = uStack_1157;
      auVar34[3] = uStack_1167;
      auVar34[4] = uStack_1156;
      auVar34[5] = uStack_1166;
      auVar34[6] = uStack_1155;
      auVar34[7] = uStack_1165;
      uStack_1a60._0_2_ = CONCAT11(uStack_1164,uStack_1154);
      uStack_1a60._0_3_ = CONCAT12(uStack_1153,(undefined2)uStack_1a60);
      uStack_1a60._0_4_ = CONCAT13(uStack_1163,(undefined3)uStack_1a60);
      uStack_1a60._0_5_ = CONCAT14(uStack_1152,(undefined4)uStack_1a60);
      uStack_1a60._0_6_ = CONCAT15(uStack_1162,(undefined5)uStack_1a60);
      uStack_1a60._0_7_ = CONCAT16(uStack_1151,(undefined6)uStack_1a60);
      uStack_1a60 = CONCAT17(uStack_1161,(undefined7)uStack_1a60);
      auVar34._8_8_ = uStack_1a60;
      auVar80 = pmaddubsw(auVar34,auVar76);
      uVar2 = CONCAT17(uStack_1185,
                       CONCAT16(uStack_1175,
                                CONCAT15(uStack_1186,
                                         CONCAT14(uStack_1176,
                                                  CONCAT13(uStack_1187,
                                                           CONCAT12(uStack_1177,
                                                                    CONCAT11((char)uVar3,local_1178)
                                                                   ))))));
      uStack_1a70._0_2_ = CONCAT11(uStack_1184,uStack_1174);
      uStack_1a70._0_3_ = CONCAT12(uStack_1173,(undefined2)uStack_1a70);
      uStack_1a70._0_4_ = CONCAT13(uStack_1183,(undefined3)uStack_1a70);
      uStack_1a70._0_5_ = CONCAT14(uStack_1172,(undefined4)uStack_1a70);
      uStack_1a70._0_6_ = CONCAT15(uStack_1182,(undefined5)uStack_1a70);
      uStack_1a70._0_7_ = CONCAT16(uStack_1171,(undefined6)uStack_1a70);
      uStack_1a70 = CONCAT17(uStack_1181,(undefined7)uStack_1a70);
      auVar33._8_8_ = uStack_1a70;
      auVar33._0_8_ = uVar2;
      auVar81 = pmaddubsw(auVar33,auVar77);
      local_1a88 = CONCAT17(uStack_11a5,
                            CONCAT16(uStack_1195,
                                     CONCAT15(uStack_11a6,
                                              CONCAT14(uStack_1196,
                                                       CONCAT13(uStack_11a7,
                                                                CONCAT12(uStack_1197,
                                                                         CONCAT11(local_11a8,
                                                                                  local_1198)))))));
      uStack_1a80._0_2_ = CONCAT11(uStack_11a4,uStack_1194);
      uStack_1a80._0_3_ = CONCAT12(uStack_1193,(undefined2)uStack_1a80);
      uStack_1a80._0_4_ = CONCAT13(uStack_11a3,(undefined3)uStack_1a80);
      uStack_1a80._0_5_ = CONCAT14(uStack_1192,(undefined4)uStack_1a80);
      uStack_1a80._0_6_ = CONCAT15(uStack_11a2,(undefined5)uStack_1a80);
      uStack_1a80._0_7_ = CONCAT16(uStack_1191,(undefined6)uStack_1a80);
      uStack_1a80 = CONCAT17(uStack_11a1,(undefined7)uStack_1a80);
      auVar32._8_8_ = uStack_1a80;
      auVar32._0_8_ = local_1a88;
      auVar82 = pmaddubsw(auVar32,auVar78);
      auVar31[1] = local_11c8;
      auVar31[0] = local_11b8;
      auVar31[2] = uStack_11b7;
      auVar31[3] = uStack_11c7;
      auVar31[4] = uStack_11b6;
      auVar31[5] = uStack_11c6;
      auVar31[6] = uStack_11b5;
      auVar31[7] = uStack_11c5;
      auVar31[9] = uStack_11c4;
      auVar31[8] = uStack_11b4;
      auVar31[10] = uStack_11b3;
      auVar31[0xb] = uStack_11c3;
      auVar31[0xc] = uStack_11b2;
      auVar31[0xd] = uStack_11c2;
      auVar31[0xe] = uStack_11b1;
      auVar31[0xf] = uStack_11c1;
      auVar83 = pmaddubsw(auVar31,auVar79);
      local_548 = auVar80._0_2_;
      sStack_546 = auVar80._2_2_;
      sStack_544 = auVar80._4_2_;
      sStack_542 = auVar80._6_2_;
      local_558 = auVar81._0_2_;
      sStack_556 = auVar81._2_2_;
      sStack_554 = auVar81._4_2_;
      sStack_552 = auVar81._6_2_;
      local_568 = auVar82._0_2_;
      sStack_566 = auVar82._2_2_;
      sStack_564 = auVar82._4_2_;
      sStack_562 = auVar82._6_2_;
      local_578 = auVar83._0_2_;
      sStack_576 = auVar83._2_2_;
      sStack_574 = auVar83._4_2_;
      sStack_572 = auVar83._6_2_;
      *(ulong *)((long)local_1878 + (long)in_ECX * 2) =
           CONCAT26(sStack_542 + sStack_552 + sStack_562 + sStack_572,
                    CONCAT24(sStack_544 + sStack_554 + sStack_564 + sStack_574,
                             CONCAT22(sStack_546 + sStack_556 + sStack_566 + sStack_576,
                                      local_548 + local_558 + local_568 + local_578)));
      auVar30._8_8_ = uStack_1a70;
      auVar30._0_8_ = uVar2;
      auVar80 = pmaddubsw(auVar30,auVar76);
      auVar29._8_8_ = uStack_1a80;
      auVar29._0_8_ = local_1a88;
      auVar81 = pmaddubsw(auVar29,auVar77);
      auVar28[1] = local_11c8;
      auVar28[0] = local_11b8;
      auVar28[2] = uStack_11b7;
      auVar28[3] = uStack_11c7;
      auVar28[4] = uStack_11b6;
      auVar28[5] = uStack_11c6;
      auVar28[6] = uStack_11b5;
      auVar28[7] = uStack_11c5;
      auVar28[9] = uStack_11c4;
      auVar28[8] = uStack_11b4;
      auVar28[10] = uStack_11b3;
      auVar28[0xb] = uStack_11c3;
      auVar28[0xc] = uStack_11b2;
      auVar28[0xd] = uStack_11c2;
      auVar28[0xe] = uStack_11b1;
      auVar28[0xf] = uStack_11c1;
      auVar82 = pmaddubsw(auVar28,auVar78);
      local_1a08 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * 7));
      local_1278 = (undefined1)local_1a08;
      uStack_1277 = (undefined1)((ulong)local_1a08 >> 8);
      uStack_1276 = (undefined1)((ulong)local_1a08 >> 0x10);
      uStack_1275 = (undefined1)((ulong)local_1a08 >> 0x18);
      uStack_1274 = (undefined1)((ulong)local_1a08 >> 0x20);
      uStack_1273 = (undefined1)((ulong)local_1a08 >> 0x28);
      uStack_1272 = (undefined1)((ulong)local_1a08 >> 0x30);
      uStack_1271 = (undefined1)((ulong)local_1a08 >> 0x38);
      uStack_1aa7 = local_1278;
      uStack_1aa5 = uStack_1277;
      uStack_1aa3 = uStack_1276;
      uStack_1aa1 = uStack_1275;
      uStack_1a9f = uStack_1274;
      uStack_1a9d = uStack_1273;
      uStack_1a9b = uStack_1272;
      uStack_1a99 = uStack_1271;
      auVar27[1] = local_1278;
      auVar27[0] = local_11d8;
      auVar27[2] = uStack_11d7;
      auVar27[3] = uStack_1277;
      auVar27[4] = uStack_11d6;
      auVar27[5] = uStack_1276;
      auVar27[6] = uStack_11d5;
      auVar27[7] = uStack_1275;
      auVar27[9] = uStack_1274;
      auVar27[8] = uStack_11d4;
      auVar27[10] = uStack_11d3;
      auVar27[0xb] = uStack_1273;
      auVar27[0xc] = uStack_11d2;
      auVar27[0xd] = uStack_1272;
      auVar27[0xe] = uStack_11d1;
      auVar27[0xf] = uStack_1271;
      auVar83 = pmaddubsw(auVar27,auVar79);
      local_5a8 = auVar80._0_2_;
      sStack_5a6 = auVar80._2_2_;
      sStack_5a4 = auVar80._4_2_;
      sStack_5a2 = auVar80._6_2_;
      local_5b8 = auVar81._0_2_;
      sStack_5b6 = auVar81._2_2_;
      sStack_5b4 = auVar81._4_2_;
      sStack_5b2 = auVar81._6_2_;
      local_5c8 = auVar82._0_2_;
      sStack_5c6 = auVar82._2_2_;
      sStack_5c4 = auVar82._4_2_;
      sStack_5c2 = auVar82._6_2_;
      local_5d8 = auVar83._0_2_;
      sStack_5d6 = auVar83._2_2_;
      sStack_5d4 = auVar83._4_2_;
      sStack_5d2 = auVar83._6_2_;
      *(ulong *)((long)local_1878 + (long)(in_ECX * 3) * 2) =
           CONCAT26(sStack_5a2 + sStack_5b2 + sStack_5c2 + sStack_5d2,
                    CONCAT24(sStack_5a4 + sStack_5b4 + sStack_5c4 + sStack_5d4,
                             CONCAT22(sStack_5a6 + sStack_5b6 + sStack_5c6 + sStack_5d6,
                                      local_5a8 + local_5b8 + local_5c8 + local_5d8)));
      local_1870 = (undefined8 *)((long)local_1870 + (long)(in_EDX << 3));
      local_1878 = (undefined8 *)((long)local_1878 + (long)(in_ECX << 2) * 2);
      for (local_1890 = 4; local_1890 < in_R9D; local_1890 = local_1890 + 4) {
        uVar3 = CONCAT17(uStack_1a41,
                         CONCAT16(uStack_1a42,
                                  CONCAT15(uStack_1a43,
                                           CONCAT14(uStack_1a44,
                                                    CONCAT13(uStack_1a45,
                                                             CONCAT12(uStack_1a46,
                                                                      CONCAT11(uStack_1a47,
                                                                               local_1a48)))))));
        uVar10 = CONCAT17(uStack_1a39,
                          CONCAT16(uStack_1a3a,
                                   CONCAT15(uStack_1a3b,
                                            CONCAT14(uStack_1a3c,
                                                     CONCAT13(uStack_1a3d,
                                                              CONCAT12(uStack_1a3e,
                                                                       CONCAT11(uStack_1a3f,
                                                                                uStack_1a40)))))));
        uVar8 = CONCAT17(uStack_1a51,
                         CONCAT16(uStack_1a52,
                                  CONCAT15(uStack_1a53,
                                           CONCAT14(uStack_1a54,
                                                    CONCAT13(uStack_1a55,
                                                             CONCAT12(uStack_1a56,
                                                                      CONCAT11(uStack_1a57,
                                                                               local_1a58)))))));
        uVar9 = CONCAT17(uStack_1a49,
                         CONCAT16(uStack_1a4a,
                                  CONCAT15(uStack_1a4b,
                                           CONCAT14(uStack_1a4c,
                                                    CONCAT13(uStack_1a4d,
                                                             CONCAT12(uStack_1a4e,
                                                                      CONCAT11(uStack_1a4f,
                                                                               uStack_1a50)))))));
        auVar26._8_8_ = uStack_1a30;
        auVar26._0_8_ = local_1a38;
        auVar80 = pmaddubsw(auVar26,auVar76);
        auVar25._8_8_ = uVar10;
        auVar25._0_8_ = uVar3;
        auVar81 = pmaddubsw(auVar25,auVar77);
        auVar24._8_8_ = uVar9;
        auVar24._0_8_ = uVar8;
        auVar82 = pmaddubsw(auVar24,auVar78);
        uVar2 = *local_1870;
        local_1288 = (undefined1)local_1a08;
        local_1a48 = local_1288;
        uStack_1287 = (undefined1)((ulong)local_1a08 >> 8);
        uStack_1a46 = uStack_1287;
        uStack_1286 = (undefined1)((ulong)local_1a08 >> 0x10);
        uStack_1a44 = uStack_1286;
        uStack_1285 = (undefined1)((ulong)local_1a08 >> 0x18);
        uStack_1a42 = uStack_1285;
        uStack_1284 = (undefined1)((ulong)local_1a08 >> 0x20);
        uStack_1a40 = uStack_1284;
        uStack_1283 = (undefined1)((ulong)local_1a08 >> 0x28);
        uStack_1a3e = uStack_1283;
        uStack_1282 = (undefined1)((ulong)local_1a08 >> 0x30);
        uStack_1a3c = uStack_1282;
        uStack_1281 = (undefined1)((ulong)local_1a08 >> 0x38);
        uStack_1a3a = uStack_1281;
        local_1298 = (undefined1)uVar2;
        uStack_1297 = (undefined1)((ulong)uVar2 >> 8);
        uStack_1296 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_1295 = (undefined1)((ulong)uVar2 >> 0x18);
        uStack_1294 = (undefined1)((ulong)uVar2 >> 0x20);
        uStack_1293 = (undefined1)((ulong)uVar2 >> 0x28);
        uStack_1292 = (undefined1)((ulong)uVar2 >> 0x30);
        uStack_1291 = (undefined1)((ulong)uVar2 >> 0x38);
        auVar23[1] = local_1298;
        auVar23[0] = local_1288;
        auVar23[2] = uStack_1287;
        auVar23[3] = uStack_1297;
        auVar23[4] = uStack_1286;
        auVar23[5] = uStack_1296;
        auVar23[6] = uStack_1285;
        auVar23[7] = uStack_1295;
        auVar23[9] = uStack_1294;
        auVar23[8] = uStack_1284;
        auVar23[10] = uStack_1283;
        auVar23[0xb] = uStack_1293;
        auVar23[0xc] = uStack_1282;
        auVar23[0xd] = uStack_1292;
        auVar23[0xe] = uStack_1281;
        auVar23[0xf] = uStack_1291;
        auVar83 = pmaddubsw(auVar23,auVar79);
        uVar6 = CONCAT17(uStack_1a52,
                         CONCAT16(uStack_1a41,
                                  CONCAT15(uStack_1a54,
                                           CONCAT14(uStack_1a43,
                                                    CONCAT13(uStack_1a56,
                                                             CONCAT12(uStack_1a45,
                                                                      CONCAT11(local_1a58,
                                                                               uStack_1a47)))))));
        uVar7 = CONCAT17(uStack_1a4a,
                         CONCAT16(uStack_1a39,
                                  CONCAT15(uStack_1a4c,
                                           CONCAT14(uStack_1a3b,
                                                    CONCAT13(uStack_1a4e,
                                                             CONCAT12(uStack_1a3d,
                                                                      CONCAT11(uStack_1a50,
                                                                               uStack_1a3f)))))));
        uVar4 = CONCAT17(uStack_1aa1,
                         CONCAT16(uStack_1a51,
                                  CONCAT15(uStack_1aa3,
                                           CONCAT14(uStack_1a53,
                                                    CONCAT13(uStack_1aa5,
                                                             CONCAT12(uStack_1a55,
                                                                      CONCAT11(uStack_1aa7,
                                                                               uStack_1a57)))))));
        uVar5 = CONCAT17(uStack_1a99,
                         CONCAT16(uStack_1a49,
                                  CONCAT15(uStack_1a9b,
                                           CONCAT14(uStack_1a4b,
                                                    CONCAT13(uStack_1a9d,
                                                             CONCAT12(uStack_1a4d,
                                                                      CONCAT11(uStack_1a9f,
                                                                               uStack_1a4f)))))));
        local_608 = auVar80._0_2_;
        sStack_606 = auVar80._2_2_;
        sStack_604 = auVar80._4_2_;
        sStack_602 = auVar80._6_2_;
        local_618 = auVar81._0_2_;
        sStack_616 = auVar81._2_2_;
        sStack_614 = auVar81._4_2_;
        sStack_612 = auVar81._6_2_;
        local_628 = auVar82._0_2_;
        sStack_626 = auVar82._2_2_;
        sStack_624 = auVar82._4_2_;
        sStack_622 = auVar82._6_2_;
        local_638 = auVar83._0_2_;
        sStack_636 = auVar83._2_2_;
        sStack_634 = auVar83._4_2_;
        sStack_632 = auVar83._6_2_;
        *local_1878 = CONCAT26(sStack_602 + sStack_612 + sStack_622 + sStack_632,
                               CONCAT24(sStack_604 + sStack_614 + sStack_624 + sStack_634,
                                        CONCAT22(sStack_606 + sStack_616 + sStack_626 + sStack_636,
                                                 local_608 + local_618 + local_628 + local_638)));
        auVar22._8_8_ = uVar10;
        auVar22._0_8_ = uVar3;
        auVar80 = pmaddubsw(auVar22,auVar76);
        auVar21._8_8_ = uVar9;
        auVar21._0_8_ = uVar8;
        auVar81 = pmaddubsw(auVar21,auVar77);
        auVar20[1] = local_1298;
        auVar20[0] = local_1288;
        auVar20[2] = uStack_1287;
        auVar20[3] = uStack_1297;
        auVar20[4] = uStack_1286;
        auVar20[5] = uStack_1296;
        auVar20[6] = uStack_1285;
        auVar20[7] = uStack_1295;
        auVar20[9] = uStack_1294;
        auVar20[8] = uStack_1284;
        auVar20[10] = uStack_1283;
        auVar20[0xb] = uStack_1293;
        auVar20[0xc] = uStack_1282;
        auVar20[0xd] = uStack_1292;
        auVar20[0xe] = uStack_1281;
        auVar20[0xf] = uStack_1291;
        auVar82 = pmaddubsw(auVar20,auVar78);
        uVar2 = *(undefined8 *)((long)local_1870 + (long)in_EDX);
        uVar3 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * 2));
        local_12a8 = (undefined1)uVar2;
        local_1a58 = local_12a8;
        uStack_12a7 = (undefined1)((ulong)uVar2 >> 8);
        uStack_1a56 = uStack_12a7;
        uStack_12a6 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_1a54 = uStack_12a6;
        uStack_12a5 = (undefined1)((ulong)uVar2 >> 0x18);
        uStack_1a52 = uStack_12a5;
        uStack_12a4 = (undefined1)((ulong)uVar2 >> 0x20);
        uStack_1a50 = uStack_12a4;
        uStack_12a3 = (undefined1)((ulong)uVar2 >> 0x28);
        uStack_1a4e = uStack_12a3;
        uStack_12a2 = (undefined1)((ulong)uVar2 >> 0x30);
        uStack_1a4c = uStack_12a2;
        uStack_12a1 = (undefined1)((ulong)uVar2 >> 0x38);
        uStack_1a4a = uStack_12a1;
        local_12b8 = (undefined1)uVar3;
        uStack_1a57 = local_12b8;
        uStack_12b7 = (undefined1)((ulong)uVar3 >> 8);
        uStack_1a55 = uStack_12b7;
        uStack_12b6 = (undefined1)((ulong)uVar3 >> 0x10);
        uStack_1a53 = uStack_12b6;
        uStack_12b5 = (undefined1)((ulong)uVar3 >> 0x18);
        uStack_1a51 = uStack_12b5;
        uStack_12b4 = (undefined1)((ulong)uVar3 >> 0x20);
        uStack_1a4f = uStack_12b4;
        uStack_12b3 = (undefined1)((ulong)uVar3 >> 0x28);
        uStack_1a4d = uStack_12b3;
        uStack_12b2 = (undefined1)((ulong)uVar3 >> 0x30);
        uStack_1a4b = uStack_12b2;
        uStack_12b1 = (undefined1)((ulong)uVar3 >> 0x38);
        uStack_1a49 = uStack_12b1;
        auVar19[1] = local_12b8;
        auVar19[0] = local_12a8;
        auVar19[2] = uStack_12a7;
        auVar19[3] = uStack_12b7;
        auVar19[4] = uStack_12a6;
        auVar19[5] = uStack_12b6;
        auVar19[6] = uStack_12a5;
        auVar19[7] = uStack_12b5;
        auVar19[9] = uStack_12b4;
        auVar19[8] = uStack_12a4;
        auVar19[10] = uStack_12a3;
        auVar19[0xb] = uStack_12b3;
        auVar19[0xc] = uStack_12a2;
        auVar19[0xd] = uStack_12b2;
        auVar19[0xe] = uStack_12a1;
        auVar19[0xf] = uStack_12b1;
        auVar83 = pmaddubsw(auVar19,auVar79);
        local_668 = auVar80._0_2_;
        sStack_666 = auVar80._2_2_;
        sStack_664 = auVar80._4_2_;
        sStack_662 = auVar80._6_2_;
        local_678 = auVar81._0_2_;
        sStack_676 = auVar81._2_2_;
        sStack_674 = auVar81._4_2_;
        sStack_672 = auVar81._6_2_;
        local_688 = auVar82._0_2_;
        sStack_686 = auVar82._2_2_;
        sStack_684 = auVar82._4_2_;
        sStack_682 = auVar82._6_2_;
        local_698 = auVar83._0_2_;
        sStack_696 = auVar83._2_2_;
        sStack_694 = auVar83._4_2_;
        sStack_692 = auVar83._6_2_;
        *(ulong *)((long)local_1878 + (long)(in_ECX * 2) * 2) =
             CONCAT26(sStack_662 + sStack_672 + sStack_682 + sStack_692,
                      CONCAT24(sStack_664 + sStack_674 + sStack_684 + sStack_694,
                               CONCAT22(sStack_666 + sStack_676 + sStack_686 + sStack_696,
                                        local_668 + local_678 + local_688 + local_698)));
        auVar18._8_8_ = uStack_1a80;
        auVar18._0_8_ = local_1a88;
        auVar80 = pmaddubsw(auVar18,auVar76);
        auVar17._8_8_ = uVar7;
        auVar17._0_8_ = uVar6;
        auVar81 = pmaddubsw(auVar17,auVar77);
        auVar16._8_8_ = uVar5;
        auVar16._0_8_ = uVar4;
        auVar82 = pmaddubsw(auVar16,auVar78);
        auVar15[1] = local_12a8;
        auVar15[0] = local_1298;
        auVar15[2] = uStack_1297;
        auVar15[3] = uStack_12a7;
        auVar15[4] = uStack_1296;
        auVar15[5] = uStack_12a6;
        auVar15[6] = uStack_1295;
        auVar15[7] = uStack_12a5;
        auVar15[9] = uStack_12a4;
        auVar15[8] = uStack_1294;
        auVar15[10] = uStack_1293;
        auVar15[0xb] = uStack_12a3;
        auVar15[0xc] = uStack_1292;
        auVar15[0xd] = uStack_12a2;
        auVar15[0xe] = uStack_1291;
        auVar15[0xf] = uStack_12a1;
        auVar83 = pmaddubsw(auVar15,auVar79);
        local_6c8 = auVar80._0_2_;
        sStack_6c6 = auVar80._2_2_;
        sStack_6c4 = auVar80._4_2_;
        sStack_6c2 = auVar80._6_2_;
        local_6d8 = auVar81._0_2_;
        sStack_6d6 = auVar81._2_2_;
        sStack_6d4 = auVar81._4_2_;
        sStack_6d2 = auVar81._6_2_;
        local_6e8 = auVar82._0_2_;
        sStack_6e6 = auVar82._2_2_;
        sStack_6e4 = auVar82._4_2_;
        sStack_6e2 = auVar82._6_2_;
        local_6f8 = auVar83._0_2_;
        sStack_6f6 = auVar83._2_2_;
        sStack_6f4 = auVar83._4_2_;
        sStack_6f2 = auVar83._6_2_;
        *(ulong *)((long)local_1878 + (long)in_ECX * 2) =
             CONCAT26(sStack_6c2 + sStack_6d2 + sStack_6e2 + sStack_6f2,
                      CONCAT24(sStack_6c4 + sStack_6d4 + sStack_6e4 + sStack_6f4,
                               CONCAT22(sStack_6c6 + sStack_6d6 + sStack_6e6 + sStack_6f6,
                                        local_6c8 + local_6d8 + local_6e8 + local_6f8)));
        auVar14._8_8_ = uVar7;
        auVar14._0_8_ = uVar6;
        auVar80 = pmaddubsw(auVar14,auVar76);
        auVar13._8_8_ = uVar5;
        auVar13._0_8_ = uVar4;
        auVar81 = pmaddubsw(auVar13,auVar77);
        auVar12[1] = local_12a8;
        auVar12[0] = local_1298;
        auVar12[2] = uStack_1297;
        auVar12[3] = uStack_12a7;
        auVar12[4] = uStack_1296;
        auVar12[5] = uStack_12a6;
        auVar12[6] = uStack_1295;
        auVar12[7] = uStack_12a5;
        auVar12[9] = uStack_12a4;
        auVar12[8] = uStack_1294;
        auVar12[10] = uStack_1293;
        auVar12[0xb] = uStack_12a3;
        auVar12[0xc] = uStack_1292;
        auVar12[0xd] = uStack_12a2;
        auVar12[0xe] = uStack_1291;
        auVar12[0xf] = uStack_12a1;
        auVar82 = pmaddubsw(auVar12,auVar78);
        local_1a08 = *(undefined8 *)((long)local_1870 + (long)(in_EDX * 3));
        local_12f8 = (undefined1)local_1a08;
        uStack_1aa7 = local_12f8;
        uStack_12f7 = (undefined1)((ulong)local_1a08 >> 8);
        uStack_1aa5 = uStack_12f7;
        uStack_12f6 = (undefined1)((ulong)local_1a08 >> 0x10);
        uStack_1aa3 = uStack_12f6;
        uStack_12f5 = (undefined1)((ulong)local_1a08 >> 0x18);
        uStack_1aa1 = uStack_12f5;
        uStack_12f4 = (undefined1)((ulong)local_1a08 >> 0x20);
        uStack_1a9f = uStack_12f4;
        uStack_12f3 = (undefined1)((ulong)local_1a08 >> 0x28);
        uStack_1a9d = uStack_12f3;
        uStack_12f2 = (undefined1)((ulong)local_1a08 >> 0x30);
        uStack_1a9b = uStack_12f2;
        uStack_12f1 = (undefined1)((ulong)local_1a08 >> 0x38);
        uStack_1a99 = uStack_12f1;
        auVar11[1] = local_12f8;
        auVar11[0] = local_12b8;
        auVar11[2] = uStack_12b7;
        auVar11[3] = uStack_12f7;
        auVar11[4] = uStack_12b6;
        auVar11[5] = uStack_12f6;
        auVar11[6] = uStack_12b5;
        auVar11[7] = uStack_12f5;
        auVar11[9] = uStack_12f4;
        auVar11[8] = uStack_12b4;
        auVar11[10] = uStack_12b3;
        auVar11[0xb] = uStack_12f3;
        auVar11[0xc] = uStack_12b2;
        auVar11[0xd] = uStack_12f2;
        auVar11[0xe] = uStack_12b1;
        auVar11[0xf] = uStack_12f1;
        auVar83 = pmaddubsw(auVar11,auVar79);
        local_728 = auVar80._0_2_;
        sStack_726 = auVar80._2_2_;
        sStack_724 = auVar80._4_2_;
        sStack_722 = auVar80._6_2_;
        local_738 = auVar81._0_2_;
        sStack_736 = auVar81._2_2_;
        sStack_734 = auVar81._4_2_;
        sStack_732 = auVar81._6_2_;
        local_748 = auVar82._0_2_;
        sStack_746 = auVar82._2_2_;
        sStack_744 = auVar82._4_2_;
        sStack_742 = auVar82._6_2_;
        local_758 = auVar83._0_2_;
        sStack_756 = auVar83._2_2_;
        sStack_754 = auVar83._4_2_;
        sStack_752 = auVar83._6_2_;
        *(ulong *)((long)local_1878 + (long)(in_ECX * 3) * 2) =
             CONCAT26(sStack_722 + sStack_732 + sStack_742 + sStack_752,
                      CONCAT24(sStack_724 + sStack_734 + sStack_744 + sStack_754,
                               CONCAT22(sStack_726 + sStack_736 + sStack_746 + sStack_756,
                                        local_728 + local_738 + local_748 + local_758)));
        local_1870 = (undefined8 *)((long)local_1870 + (long)(in_EDX << 2));
        local_1878 = (undefined8 *)((long)local_1878 + (long)(in_ECX << 2) * 2);
        local_1a88 = uVar4;
        uStack_1a80 = uVar5;
        uStack_1a47 = local_1298;
        uStack_1a45 = uStack_1297;
        uStack_1a43 = uStack_1296;
        uStack_1a41 = uStack_1295;
        uStack_1a3f = uStack_1294;
        uStack_1a3d = uStack_1293;
        uStack_1a3b = uStack_1292;
        uStack_1a39 = uStack_1291;
        local_1a38 = uVar8;
        uStack_1a30 = uVar9;
      }
    }
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_vert_w16out_ssse3(UWORD8 *pu1_src,
                                             WORD16 *pi2_dst,
                                             WORD32 src_strd,
                                             WORD32 dst_strd,
                                             WORD8 *pi1_coeff,
                                             WORD32 ht,
                                             WORD32 wd)
{
    WORD32 row, col;
    UWORD8 *pu1_src_copy;
    WORD16 *pi2_dst_copy;
    __m128i coeff0_1_8x16b, coeff2_3_8x16b, coeff4_5_8x16b, coeff6_7_8x16b;
    __m128i s0_8x16b, s1_8x16b, s2_8x16b, s3_8x16b, s4_8x16b, s5_8x16b, s6_8x16b;
    __m128i s2_0_16x8b, s2_1_16x8b, s2_2_16x8b, s2_3_16x8b, s2_4_16x8b, s2_5_16x8b, s2_6_16x8b, s2_7_16x8b, s2_8_16x8b, s2_9_16x8b, s2_10_16x8b;
    __m128i s3_0_16x8b, s3_1_16x8b, s3_2_16x8b, s3_3_16x8b, s3_4_16x8b;
    __m128i s4_0_16x8b, s4_1_16x8b, s4_2_16x8b, s4_3_16x8b, s4_4_16x8b;
    __m128i s10_8x16b, s11_8x16b, s12_8x16b, s13_8x16b, s14_8x16b, s15_8x16b, s16_8x16b;
    __m128i s20_8x16b, s21_8x16b, s22_8x16b, s23_8x16b, s24_8x16b, s25_8x16b, s26_8x16b;
    __m128i s30_8x16b, s31_8x16b, s32_8x16b, s33_8x16b, s34_8x16b, s35_8x16b, s36_8x16b;


    __m128i control_mask_1_8x16b, control_mask_2_8x16b, control_mask_3_8x16b, control_mask_4_8x16b;

/* load 8 8-bit coefficients and convert 8-bit into 16-bit  */
    s4_8x16b = _mm_loadl_epi64((__m128i *)pi1_coeff);

    control_mask_1_8x16b = _mm_set1_epi32(0x01000100); /* Control Mask register */
    control_mask_2_8x16b = _mm_set1_epi32(0x03020302); /* Control Mask register */
    control_mask_3_8x16b = _mm_set1_epi32(0x05040504); /* Control Mask register */
    control_mask_4_8x16b = _mm_set1_epi32(0x07060706); /* Control Mask register */

    coeff0_1_8x16b = _mm_shuffle_epi8(s4_8x16b, control_mask_1_8x16b);  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi8(s4_8x16b, control_mask_2_8x16b);  /* pi1_coeff[4] */

    coeff4_5_8x16b = _mm_shuffle_epi8(s4_8x16b, control_mask_3_8x16b);  /* pi1_coeff[4] */
    coeff6_7_8x16b = _mm_shuffle_epi8(s4_8x16b, control_mask_4_8x16b);  /* pi1_coeff[4] */


/*  outer for loop starts from here */
    if((wd % 8) == 0)
    { /* wd = multiple of 8 case */

        pu1_src_copy = pu1_src;
        pi2_dst_copy = pi2_dst;

        for(col = 0; col < wd; col += 8)
        {

            pu1_src = pu1_src_copy + col;
            pi2_dst = pi2_dst_copy + col;

            PREFETCH((char const *)(pu1_src + (8 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (9 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (10 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (11 * src_strd)), _MM_HINT_T0)

            /*load 8 pixel values */
            s2_0_16x8b  = _mm_loadl_epi64((__m128i *)(pu1_src + (-3 * src_strd)));

            /*load 8 pixel values */
            s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (-2 * src_strd)));

            s3_0_16x8b = _mm_unpacklo_epi8(s2_0_16x8b, s2_1_16x8b);

            s0_8x16b = _mm_maddubs_epi16(s3_0_16x8b, coeff0_1_8x16b);

            /*load 8 pixel values */
            s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (-1 * src_strd)));

            /*load 8 pixel values */
            s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (0 * src_strd)));

            s3_1_16x8b = _mm_unpacklo_epi8(s2_2_16x8b, s2_3_16x8b);

            s1_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff2_3_8x16b);

            /*load 8 pixel values */
            s2_4_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (1 * src_strd)));

            /*load 8 pixel values */
            s2_5_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (2 * src_strd)));

            s3_2_16x8b = _mm_unpacklo_epi8(s2_4_16x8b, s2_5_16x8b);

            s2_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_6_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (3 * src_strd)));

            /*load 8 pixel values */
            s2_7_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (4 * src_strd)));

            s3_3_16x8b = _mm_unpacklo_epi8(s2_6_16x8b, s2_7_16x8b);

            s3_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff6_7_8x16b);

            s4_8x16b = _mm_add_epi16(s0_8x16b, s1_8x16b);
            s5_8x16b = _mm_add_epi16(s2_8x16b, s3_8x16b);
            s6_8x16b = _mm_add_epi16(s4_8x16b, s5_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 0*/
            _mm_store_si128((__m128i *)(pi2_dst), s6_8x16b);

            /* ROW 2*/
            s20_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff0_1_8x16b);
            s21_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff2_3_8x16b);
            s22_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_8_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (5 * src_strd)));

            /*load 8 pixel values */
            s2_9_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (6 * src_strd)));

            s3_4_16x8b = _mm_unpacklo_epi8(s2_8_16x8b, s2_9_16x8b);

            s23_8x16b = _mm_maddubs_epi16(s3_4_16x8b, coeff6_7_8x16b);

            s24_8x16b = _mm_add_epi16(s20_8x16b, s21_8x16b);
            s25_8x16b = _mm_add_epi16(s22_8x16b, s23_8x16b);
            s26_8x16b = _mm_add_epi16(s24_8x16b, s25_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 2*/
            _mm_store_si128((__m128i *)(pi2_dst + (2 * dst_strd)), s26_8x16b);


            /*ROW 1*/
            s4_0_16x8b = _mm_unpacklo_epi8(s2_1_16x8b, s2_2_16x8b);

            s10_8x16b = _mm_maddubs_epi16(s4_0_16x8b, coeff0_1_8x16b);

            s4_1_16x8b = _mm_unpacklo_epi8(s2_3_16x8b, s2_4_16x8b);

            s11_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff2_3_8x16b);

            s4_2_16x8b = _mm_unpacklo_epi8(s2_5_16x8b, s2_6_16x8b);

            s12_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff4_5_8x16b);

            s4_3_16x8b = _mm_unpacklo_epi8(s2_7_16x8b, s2_8_16x8b);

            s13_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff6_7_8x16b);

            s14_8x16b = _mm_add_epi16(s10_8x16b, s11_8x16b);
            s15_8x16b = _mm_add_epi16(s12_8x16b, s13_8x16b);
            s16_8x16b = _mm_add_epi16(s14_8x16b, s15_8x16b);


            /* store 8 8-bit output values  */
            /* Store the output pixels of row 1*/
            _mm_store_si128((__m128i *)(pi2_dst + (dst_strd)), s16_8x16b);


            /* ROW 3*/
            s30_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff0_1_8x16b);
            s31_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff2_3_8x16b);
            s32_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_10_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (7 * src_strd)));

            s4_4_16x8b = _mm_unpacklo_epi8(s2_9_16x8b, s2_10_16x8b);

            s33_8x16b = _mm_maddubs_epi16(s4_4_16x8b, coeff6_7_8x16b);

            s34_8x16b = _mm_add_epi16(s30_8x16b, s31_8x16b);
            s35_8x16b = _mm_add_epi16(s32_8x16b, s33_8x16b);
            s36_8x16b = _mm_add_epi16(s34_8x16b, s35_8x16b);


            /* store 8 8-bit output values  */
            /* Store the output pixels of row 2*/
            _mm_store_si128((__m128i *)(pi2_dst + (3 * dst_strd)), s36_8x16b);

            pu1_src += (8 * src_strd);
            pi2_dst += (4 * dst_strd);

            for(row = 4; row < ht; row += 4)
            {

                PREFETCH((char const *)(pu1_src + (4 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (5 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)

                s3_0_16x8b = s3_2_16x8b;
                s3_1_16x8b = s3_3_16x8b;
                s3_2_16x8b = s3_4_16x8b;

                s0_8x16b = _mm_maddubs_epi16(s3_0_16x8b, coeff0_1_8x16b);
                s1_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff2_3_8x16b);
                s2_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 4)th row*/
                s2_0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));

                s3_3_16x8b = _mm_unpacklo_epi8(s2_10_16x8b, s2_0_16x8b);
                s3_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff6_7_8x16b);

                s4_0_16x8b = s4_2_16x8b;
                s4_1_16x8b = s4_3_16x8b;
                s4_2_16x8b = s4_4_16x8b;

                s4_8x16b = _mm_add_epi16(s0_8x16b, s1_8x16b);
                s5_8x16b = _mm_add_epi16(s2_8x16b, s3_8x16b);
                s6_8x16b = _mm_add_epi16(s4_8x16b, s5_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of row 4*/
                _mm_store_si128((__m128i *)(pi2_dst), s6_8x16b);

                /* row + 2*/
                s20_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff0_1_8x16b);
                s21_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff2_3_8x16b);
                s22_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 5)th row*/
                s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + src_strd));

                /*load 8 pixel values from (cur_row + 6)th row*/
                s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (2 * src_strd)));

                /*unpacking (cur_row + 5)th row and (cur_row + 6)th row*/
                s3_4_16x8b = _mm_unpacklo_epi8(s2_1_16x8b, s2_2_16x8b);

                s23_8x16b = _mm_maddubs_epi16(s3_4_16x8b, coeff6_7_8x16b);

                s24_8x16b = _mm_add_epi16(s20_8x16b, s21_8x16b);
                s25_8x16b = _mm_add_epi16(s22_8x16b, s23_8x16b);
                s26_8x16b = _mm_add_epi16(s24_8x16b, s25_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row+2)*/
                _mm_store_si128((__m128i *)(pi2_dst + (2 * dst_strd)), s26_8x16b);


                /*row + 1*/
                s10_8x16b = _mm_maddubs_epi16(s4_0_16x8b, coeff0_1_8x16b);
                s11_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff2_3_8x16b);
                s12_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff4_5_8x16b);

                /*unpacking (cur_row + 4)th row and (cur_row + 5)th row*/
                s4_3_16x8b = _mm_unpacklo_epi8(s2_0_16x8b, s2_1_16x8b);
                s13_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff6_7_8x16b);

                s14_8x16b = _mm_add_epi16(s10_8x16b, s11_8x16b);
                s15_8x16b = _mm_add_epi16(s12_8x16b, s13_8x16b);
                s16_8x16b = _mm_add_epi16(s14_8x16b, s15_8x16b);


                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row + 1)*/
                _mm_store_si128((__m128i *)(pi2_dst + dst_strd), s16_8x16b);


                /* row + 3*/
                s30_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff0_1_8x16b);
                s31_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff2_3_8x16b);
                s32_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 7)th row*/
                s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (3 * src_strd)));

                /*unpacking (cur_row + 6)th row and (cur_row + 7)th row*/
                s4_4_16x8b = _mm_unpacklo_epi8(s2_2_16x8b, s2_3_16x8b);

                s33_8x16b = _mm_maddubs_epi16(s4_4_16x8b, coeff6_7_8x16b);

                s34_8x16b = _mm_add_epi16(s30_8x16b, s31_8x16b);
                s35_8x16b = _mm_add_epi16(s32_8x16b, s33_8x16b);
                s36_8x16b = _mm_add_epi16(s34_8x16b, s35_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row+3)*/
                _mm_store_si128((__m128i *)(pi2_dst + (3 * dst_strd)), s36_8x16b);

                s2_10_16x8b = s2_3_16x8b;


                pu1_src += 4 * src_strd; /* pointer update */
                pi2_dst += 4 * dst_strd; /* pointer update */
            }
        }
    }
    else /* wd = multiple of 8 case */
    {

        pu1_src_copy = pu1_src;
        pi2_dst_copy = pi2_dst;

        for(col = 0; col < wd; col += 4)
        {

            pu1_src = pu1_src_copy + col;
            pi2_dst = pi2_dst_copy + col;

            PREFETCH((char const *)(pu1_src + (8 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (9 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (10 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (11 * src_strd)), _MM_HINT_T0)

            /*load 8 pixel values */
            s2_0_16x8b  = _mm_loadl_epi64((__m128i *)(pu1_src + (-3 * src_strd)));

            /*load 8 pixel values */
            s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (-2 * src_strd)));

            s3_0_16x8b = _mm_unpacklo_epi8(s2_0_16x8b, s2_1_16x8b);

            s0_8x16b = _mm_maddubs_epi16(s3_0_16x8b, coeff0_1_8x16b);

            /*load 8 pixel values */
            s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (-1 * src_strd)));

            /*load 8 pixel values */
            s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (0 * src_strd)));

            s3_1_16x8b = _mm_unpacklo_epi8(s2_2_16x8b, s2_3_16x8b);

            s1_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff2_3_8x16b);

            /*load 8 pixel values */
            s2_4_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (1 * src_strd)));

            /*load 8 pixel values */
            s2_5_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (2 * src_strd)));

            s3_2_16x8b = _mm_unpacklo_epi8(s2_4_16x8b, s2_5_16x8b);

            s2_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_6_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (3 * src_strd)));

            /*load 8 pixel values */
            s2_7_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (4 * src_strd)));

            s3_3_16x8b = _mm_unpacklo_epi8(s2_6_16x8b, s2_7_16x8b);

            s3_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff6_7_8x16b);

            s4_8x16b = _mm_add_epi16(s0_8x16b, s1_8x16b);
            s5_8x16b = _mm_add_epi16(s2_8x16b, s3_8x16b);
            s6_8x16b = _mm_add_epi16(s4_8x16b, s5_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 0*/
            _mm_storel_epi64((__m128i *)(pi2_dst), s6_8x16b);

            /* ROW 2*/
            s20_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff0_1_8x16b);
            s21_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff2_3_8x16b);
            s22_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_8_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (5 * src_strd)));

            /*load 8 pixel values */
            s2_9_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (6 * src_strd)));

            s3_4_16x8b = _mm_unpacklo_epi8(s2_8_16x8b, s2_9_16x8b);

            s23_8x16b = _mm_maddubs_epi16(s3_4_16x8b, coeff6_7_8x16b);

            s24_8x16b = _mm_add_epi16(s20_8x16b, s21_8x16b);
            s25_8x16b = _mm_add_epi16(s22_8x16b, s23_8x16b);
            s26_8x16b = _mm_add_epi16(s24_8x16b, s25_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 2*/
            _mm_storel_epi64((__m128i *)(pi2_dst + (2 * dst_strd)), s26_8x16b);


            /*ROW 1*/
            s4_0_16x8b = _mm_unpacklo_epi8(s2_1_16x8b, s2_2_16x8b);

            s10_8x16b = _mm_maddubs_epi16(s4_0_16x8b, coeff0_1_8x16b);

            s4_1_16x8b = _mm_unpacklo_epi8(s2_3_16x8b, s2_4_16x8b);

            s11_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff2_3_8x16b);

            s4_2_16x8b = _mm_unpacklo_epi8(s2_5_16x8b, s2_6_16x8b);

            s12_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff4_5_8x16b);

            s4_3_16x8b = _mm_unpacklo_epi8(s2_7_16x8b, s2_8_16x8b);

            s13_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff6_7_8x16b);

            s14_8x16b = _mm_add_epi16(s10_8x16b, s11_8x16b);
            s15_8x16b = _mm_add_epi16(s12_8x16b, s13_8x16b);
            s16_8x16b = _mm_add_epi16(s14_8x16b, s15_8x16b);


            /* store 8 8-bit output values  */
            /* Store the output pixels of row 1*/
            _mm_storel_epi64((__m128i *)(pi2_dst + (dst_strd)), s16_8x16b);


            /* ROW 3*/
            s30_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff0_1_8x16b);
            s31_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff2_3_8x16b);
            s32_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_10_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (7 * src_strd)));

            s4_4_16x8b = _mm_unpacklo_epi8(s2_9_16x8b, s2_10_16x8b);

            s33_8x16b = _mm_maddubs_epi16(s4_4_16x8b, coeff6_7_8x16b);

            s34_8x16b = _mm_add_epi16(s30_8x16b, s31_8x16b);
            s35_8x16b = _mm_add_epi16(s32_8x16b, s33_8x16b);
            s36_8x16b = _mm_add_epi16(s34_8x16b, s35_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 2*/
            _mm_storel_epi64((__m128i *)(pi2_dst + (3 * dst_strd)), s36_8x16b);

            pu1_src += (8 * src_strd);
            pi2_dst += (4 * dst_strd);

            for(row = 4; row < ht; row += 4)
            {

                PREFETCH((char const *)(pu1_src + (4 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (5 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)

                s3_0_16x8b = s3_2_16x8b;
                s3_1_16x8b = s3_3_16x8b;
                s3_2_16x8b = s3_4_16x8b;

                s0_8x16b = _mm_maddubs_epi16(s3_0_16x8b, coeff0_1_8x16b);
                s1_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff2_3_8x16b);
                s2_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 4)th row*/
                s2_0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));

                s3_3_16x8b = _mm_unpacklo_epi8(s2_10_16x8b, s2_0_16x8b);
                s3_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff6_7_8x16b);

                s4_0_16x8b = s4_2_16x8b;
                s4_1_16x8b = s4_3_16x8b;
                s4_2_16x8b = s4_4_16x8b;

                s4_8x16b = _mm_add_epi16(s0_8x16b, s1_8x16b);
                s5_8x16b = _mm_add_epi16(s2_8x16b, s3_8x16b);
                s6_8x16b = _mm_add_epi16(s4_8x16b, s5_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of row 4*/
                _mm_storel_epi64((__m128i *)(pi2_dst), s6_8x16b);

                /* row + 2*/
                s20_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff0_1_8x16b);
                s21_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff2_3_8x16b);
                s22_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 5)th row*/
                s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + src_strd));

                /*load 8 pixel values from (cur_row + 6)th row*/
                s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (2 * src_strd)));

                /*unpacking (cur_row + 5)th row and (cur_row + 6)th row*/
                s3_4_16x8b = _mm_unpacklo_epi8(s2_1_16x8b, s2_2_16x8b);

                s23_8x16b = _mm_maddubs_epi16(s3_4_16x8b, coeff6_7_8x16b);

                s24_8x16b = _mm_add_epi16(s20_8x16b, s21_8x16b);
                s25_8x16b = _mm_add_epi16(s22_8x16b, s23_8x16b);
                s26_8x16b = _mm_add_epi16(s24_8x16b, s25_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row+2)*/
                _mm_storel_epi64((__m128i *)(pi2_dst + (2 * dst_strd)), s26_8x16b);


                /*row + 1*/
                s10_8x16b = _mm_maddubs_epi16(s4_0_16x8b, coeff0_1_8x16b);
                s11_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff2_3_8x16b);
                s12_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff4_5_8x16b);

                /*unpacking (cur_row + 4)th row and (cur_row + 5)th row*/
                s4_3_16x8b = _mm_unpacklo_epi8(s2_0_16x8b, s2_1_16x8b);
                s13_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff6_7_8x16b);

                s14_8x16b = _mm_add_epi16(s10_8x16b, s11_8x16b);
                s15_8x16b = _mm_add_epi16(s12_8x16b, s13_8x16b);
                s16_8x16b = _mm_add_epi16(s14_8x16b, s15_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row + 1)*/
                _mm_storel_epi64((__m128i *)(pi2_dst + dst_strd), s16_8x16b);


                /* row + 3*/
                s30_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff0_1_8x16b);
                s31_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff2_3_8x16b);
                s32_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 7)th row*/
                s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (3 * src_strd)));

                /*unpacking (cur_row + 6)th row and (cur_row + 7)th row*/
                s4_4_16x8b = _mm_unpacklo_epi8(s2_2_16x8b, s2_3_16x8b);

                s33_8x16b = _mm_maddubs_epi16(s4_4_16x8b, coeff6_7_8x16b);

                s34_8x16b = _mm_add_epi16(s30_8x16b, s31_8x16b);
                s35_8x16b = _mm_add_epi16(s32_8x16b, s33_8x16b);
                s36_8x16b = _mm_add_epi16(s34_8x16b, s35_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row+3)*/
                _mm_storel_epi64((__m128i *)(pi2_dst + (3 * dst_strd)), s36_8x16b);

                s2_10_16x8b = s2_3_16x8b;

                pu1_src += 4 * src_strd; /* pointer update */
                pi2_dst += 4 * dst_strd; /* pointer update */
            }
        }
    }
}